

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<4>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  ulong uVar54;
  ulong uVar55;
  bool bVar56;
  undefined1 uVar57;
  bool bVar58;
  undefined1 uVar59;
  ulong uVar60;
  uint uVar61;
  uint uVar110;
  uint uVar111;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar113;
  uint uVar114;
  uint uVar115;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  uint uVar112;
  uint uVar116;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined4 uVar117;
  vint4 bi_2;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar121 [16];
  float fVar132;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar133;
  float fVar134;
  float fVar148;
  float fVar150;
  vint4 bi_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  vint4 ai_2;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  vint4 ai;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  vint4 ai_1;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [64];
  undefined1 auVar227 [28];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 auVar236 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_958;
  int local_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  undefined4 local_888;
  uint local_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [16];
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined4 local_5b8;
  float local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  uint local_5a4;
  uint local_5a0;
  ulong local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  Primitive *local_4d0;
  ulong local_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar102 [32];
  
  PVar3 = prim[1];
  uVar60 = (ulong)(byte)PVar3;
  fVar133 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar66 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar181._0_4_ = fVar133 * auVar66._0_4_;
  auVar181._4_4_ = fVar133 * auVar66._4_4_;
  auVar181._8_4_ = fVar133 * auVar66._8_4_;
  auVar181._12_4_ = fVar133 * auVar66._12_4_;
  auVar118._0_4_ = fVar133 * (ray->dir).field_0.m128[0];
  auVar118._4_4_ = fVar133 * (ray->dir).field_0.m128[1];
  auVar118._8_4_ = fVar133 * (ray->dir).field_0.m128[2];
  auVar118._12_4_ = fVar133 * (ray->dir).field_0.m128[3];
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar67 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar60 + 6)));
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar54 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar68 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + uVar60 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  uVar55 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar55 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar233._4_4_ = auVar118._0_4_;
  auVar233._0_4_ = auVar118._0_4_;
  auVar233._8_4_ = auVar118._0_4_;
  auVar233._12_4_ = auVar118._0_4_;
  auVar14 = vshufps_avx(auVar118,auVar118,0x55);
  auVar65 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar133 = auVar65._0_4_;
  auVar160._0_4_ = fVar133 * auVar69._0_4_;
  fVar148 = auVar65._4_4_;
  auVar160._4_4_ = fVar148 * auVar69._4_4_;
  fVar150 = auVar65._8_4_;
  auVar160._8_4_ = fVar150 * auVar69._8_4_;
  fVar152 = auVar65._12_4_;
  auVar160._12_4_ = fVar152 * auVar69._12_4_;
  auVar135._0_4_ = auVar71._0_4_ * fVar133;
  auVar135._4_4_ = auVar71._4_4_ * fVar148;
  auVar135._8_4_ = auVar71._8_4_ * fVar150;
  auVar135._12_4_ = auVar71._12_4_ * fVar152;
  auVar119._0_4_ = auVar13._0_4_ * fVar133;
  auVar119._4_4_ = auVar13._4_4_ * fVar148;
  auVar119._8_4_ = auVar13._8_4_ * fVar150;
  auVar119._12_4_ = auVar13._12_4_ * fVar152;
  auVar65 = vfmadd231ps_fma(auVar160,auVar14,auVar64);
  auVar63 = vfmadd231ps_fma(auVar135,auVar14,auVar67);
  auVar14 = vfmadd231ps_fma(auVar119,auVar72,auVar14);
  auVar62 = vfmadd231ps_fma(auVar65,auVar233,auVar66);
  auVar63 = vfmadd231ps_fma(auVar63,auVar233,auVar70);
  auVar118 = vfmadd231ps_fma(auVar14,auVar68,auVar233);
  auVar234._4_4_ = auVar181._0_4_;
  auVar234._0_4_ = auVar181._0_4_;
  auVar234._8_4_ = auVar181._0_4_;
  auVar234._12_4_ = auVar181._0_4_;
  auVar14 = vshufps_avx(auVar181,auVar181,0x55);
  auVar65 = vshufps_avx(auVar181,auVar181,0xaa);
  fVar133 = auVar65._0_4_;
  auVar236._0_4_ = fVar133 * auVar69._0_4_;
  fVar148 = auVar65._4_4_;
  auVar236._4_4_ = fVar148 * auVar69._4_4_;
  fVar150 = auVar65._8_4_;
  auVar236._8_4_ = fVar150 * auVar69._8_4_;
  fVar152 = auVar65._12_4_;
  auVar236._12_4_ = fVar152 * auVar69._12_4_;
  auVar196._0_4_ = auVar71._0_4_ * fVar133;
  auVar196._4_4_ = auVar71._4_4_ * fVar148;
  auVar196._8_4_ = auVar71._8_4_ * fVar150;
  auVar196._12_4_ = auVar71._12_4_ * fVar152;
  auVar182._0_4_ = auVar13._0_4_ * fVar133;
  auVar182._4_4_ = auVar13._4_4_ * fVar148;
  auVar182._8_4_ = auVar13._8_4_ * fVar150;
  auVar182._12_4_ = auVar13._12_4_ * fVar152;
  auVar64 = vfmadd231ps_fma(auVar236,auVar14,auVar64);
  auVar69 = vfmadd231ps_fma(auVar196,auVar14,auVar67);
  auVar67 = vfmadd231ps_fma(auVar182,auVar14,auVar72);
  auVar71 = vfmadd231ps_fma(auVar64,auVar234,auVar66);
  auVar72 = vfmadd231ps_fma(auVar69,auVar234,auVar70);
  auVar220._8_4_ = 0x7fffffff;
  auVar220._0_8_ = 0x7fffffff7fffffff;
  auVar220._12_4_ = 0x7fffffff;
  auVar13 = vfmadd231ps_fma(auVar67,auVar234,auVar68);
  auVar66 = vandps_avx(auVar62,auVar220);
  auVar213._8_4_ = 0x219392ef;
  auVar213._0_8_ = 0x219392ef219392ef;
  auVar213._12_4_ = 0x219392ef;
  uVar54 = vcmpps_avx512vl(auVar66,auVar213,1);
  bVar56 = (bool)((byte)uVar54 & 1);
  auVar65._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar62._0_4_;
  bVar56 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar62._4_4_;
  bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar62._8_4_;
  bVar56 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar62._12_4_;
  auVar66 = vandps_avx(auVar63,auVar220);
  uVar54 = vcmpps_avx512vl(auVar66,auVar213,1);
  bVar56 = (bool)((byte)uVar54 & 1);
  auVar62._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._0_4_;
  bVar56 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._4_4_;
  bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._8_4_;
  bVar56 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar63._12_4_;
  auVar66 = vandps_avx(auVar118,auVar220);
  uVar54 = vcmpps_avx512vl(auVar66,auVar213,1);
  bVar56 = (bool)((byte)uVar54 & 1);
  auVar63._0_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar118._0_4_;
  bVar56 = (bool)((byte)(uVar54 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar118._4_4_;
  bVar56 = (bool)((byte)(uVar54 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar118._8_4_;
  bVar56 = (bool)((byte)(uVar54 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar56 * 0x219392ef | (uint)!bVar56 * auVar118._12_4_;
  auVar64 = vrcp14ps_avx512vl(auVar65);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = 0x3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar66 = vfnmadd213ps_fma(auVar65,auVar64,auVar214);
  auVar70 = vfmadd132ps_fma(auVar66,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar62);
  auVar66 = vfnmadd213ps_fma(auVar62,auVar64,auVar214);
  auVar67 = vfmadd132ps_fma(auVar66,auVar64,auVar64);
  auVar64 = vrcp14ps_avx512vl(auVar63);
  auVar66 = vfnmadd213ps_fma(auVar63,auVar64,auVar214);
  auVar68 = vfmadd132ps_fma(auVar66,auVar64,auVar64);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar66 = vpmovsxwd_avx(auVar66);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar71);
  auVar204._0_4_ = auVar70._0_4_ * auVar66._0_4_;
  auVar204._4_4_ = auVar70._4_4_ * auVar66._4_4_;
  auVar204._8_4_ = auVar70._8_4_ * auVar66._8_4_;
  auVar204._12_4_ = auVar70._12_4_ * auVar66._12_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar66 = vpmovsxwd_avx(auVar64);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar71);
  auVar65 = vpbroadcastd_avx512vl();
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar64 = vpmovsxwd_avx(auVar69);
  auVar161._0_4_ = auVar70._0_4_ * auVar66._0_4_;
  auVar161._4_4_ = auVar70._4_4_ * auVar66._4_4_;
  auVar161._8_4_ = auVar70._8_4_ * auVar66._8_4_;
  auVar161._12_4_ = auVar70._12_4_ * auVar66._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar60 * -2 + 6);
  auVar66 = vpmovsxwd_avx(auVar70);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar72);
  auVar215._0_4_ = auVar67._0_4_ * auVar66._0_4_;
  auVar215._4_4_ = auVar67._4_4_ * auVar66._4_4_;
  auVar215._8_4_ = auVar67._8_4_ * auVar66._8_4_;
  auVar215._12_4_ = auVar67._12_4_ * auVar66._12_4_;
  auVar66 = vcvtdq2ps_avx(auVar64);
  auVar66 = vsubps_avx(auVar66,auVar72);
  auVar136._0_4_ = auVar67._0_4_ * auVar66._0_4_;
  auVar136._4_4_ = auVar67._4_4_ * auVar66._4_4_;
  auVar136._8_4_ = auVar67._8_4_ * auVar66._8_4_;
  auVar136._12_4_ = auVar67._12_4_ * auVar66._12_4_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *(ulong *)(prim + uVar55 + uVar60 + 6);
  auVar66 = vpmovsxwd_avx(auVar67);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar13);
  auVar197._0_4_ = auVar68._0_4_ * auVar66._0_4_;
  auVar197._4_4_ = auVar68._4_4_ * auVar66._4_4_;
  auVar197._8_4_ = auVar68._8_4_ * auVar66._8_4_;
  auVar197._12_4_ = auVar68._12_4_ * auVar66._12_4_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar66 = vpmovsxwd_avx(auVar71);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar66 = vsubps_avx(auVar66,auVar13);
  auVar120._0_4_ = auVar68._0_4_ * auVar66._0_4_;
  auVar120._4_4_ = auVar68._4_4_ * auVar66._4_4_;
  auVar120._8_4_ = auVar68._8_4_ * auVar66._8_4_;
  auVar120._12_4_ = auVar68._12_4_ * auVar66._12_4_;
  auVar66 = vpminsd_avx(auVar204,auVar161);
  auVar64 = vpminsd_avx(auVar215,auVar136);
  auVar66 = vmaxps_avx(auVar66,auVar64);
  auVar64 = vpminsd_avx(auVar197,auVar120);
  uVar117 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar68._4_4_ = uVar117;
  auVar68._0_4_ = uVar117;
  auVar68._8_4_ = uVar117;
  auVar68._12_4_ = uVar117;
  auVar64 = vmaxps_avx512vl(auVar64,auVar68);
  auVar66 = vmaxps_avx(auVar66,auVar64);
  auVar72._8_4_ = 0x3f7ffffa;
  auVar72._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar72._12_4_ = 0x3f7ffffa;
  local_340 = vmulps_avx512vl(auVar66,auVar72);
  auVar66 = vpmaxsd_avx(auVar204,auVar161);
  auVar64 = vpmaxsd_avx(auVar215,auVar136);
  auVar66 = vminps_avx(auVar66,auVar64);
  auVar64 = vpmaxsd_avx(auVar197,auVar120);
  fVar133 = ray->tfar;
  auVar13._4_4_ = fVar133;
  auVar13._0_4_ = fVar133;
  auVar13._8_4_ = fVar133;
  auVar13._12_4_ = fVar133;
  auVar64 = vminps_avx512vl(auVar64,auVar13);
  auVar66 = vminps_avx(auVar66,auVar64);
  auVar14._8_4_ = 0x3f800003;
  auVar14._0_8_ = 0x3f8000033f800003;
  auVar14._12_4_ = 0x3f800003;
  auVar66 = vmulps_avx512vl(auVar66,auVar14);
  uVar15 = vcmpps_avx512vl(local_340,auVar66,2);
  local_4c8 = vpcmpgtd_avx512vl(auVar65,_DAT_01f7fcf0);
  local_4c8 = ((byte)uVar15 & 0xf) & local_4c8;
  if ((char)local_4c8 == '\0') {
    return false;
  }
  local_4d0 = prim;
LAB_01aef3ac:
  lVar20 = 0;
  for (uVar54 = local_4c8; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  local_908 = (ulong)*(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_588 = (ulong)*(uint *)(prim + lVar20 * 4 + 6);
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar20 * 4 + 6));
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar20 = *(long *)&pGVar4[1].time_range.upper;
  auVar66 = *(undefined1 (*) [16])(lVar20 + (long)p_Var5 * uVar54);
  auVar64 = *(undefined1 (*) [16])(lVar20 + (uVar54 + 1) * (long)p_Var5);
  auVar69 = *(undefined1 (*) [16])(lVar20 + (uVar54 + 2) * (long)p_Var5);
  local_4c8 = local_4c8 - 1 & local_4c8;
  auVar70 = *(undefined1 (*) [16])(lVar20 + (uVar54 + 3) * (long)p_Var5);
  if (local_4c8 != 0) {
    uVar55 = local_4c8 - 1 & local_4c8;
    for (uVar54 = local_4c8; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar55 != 0) {
      for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar205._0_4_ = auVar66._0_4_ + auVar64._0_4_ + auVar69._0_4_ + auVar70._0_4_;
  auVar205._4_4_ = auVar66._4_4_ + auVar64._4_4_ + auVar69._4_4_ + auVar70._4_4_;
  auVar205._8_4_ = auVar66._8_4_ + auVar64._8_4_ + auVar69._8_4_ + auVar70._8_4_;
  auVar205._12_4_ = auVar66._12_4_ + auVar64._12_4_ + auVar69._12_4_ + auVar70._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar21._8_4_ = 0x3e800000;
  auVar21._0_8_ = 0x3e8000003e800000;
  auVar21._12_4_ = 0x3e800000;
  auVar67 = vmulps_avx512vl(auVar205,auVar21);
  auVar67 = vsubps_avx(auVar67,(undefined1  [16])aVar1);
  auVar67 = vdpps_avx(auVar67,(undefined1  [16])aVar2,0x7f);
  auVar71 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar225._4_12_ = ZEXT812(0) << 0x20;
  auVar225._0_4_ = auVar71._0_4_;
  auVar68 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar225);
  auVar71 = vfnmadd213ss_fma(auVar68,auVar71,ZEXT416(0x40000000));
  fVar133 = auVar67._0_4_ * auVar68._0_4_ * auVar71._0_4_;
  local_520 = ZEXT416((uint)fVar133);
  auVar206._4_4_ = fVar133;
  auVar206._0_4_ = fVar133;
  auVar206._8_4_ = fVar133;
  auVar206._12_4_ = fVar133;
  fStack_930 = fVar133;
  _local_940 = auVar206;
  fStack_92c = fVar133;
  fStack_928 = fVar133;
  fStack_924 = fVar133;
  auVar67 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar206);
  auVar67 = vblendps_avx(auVar67,ZEXT816(0) << 0x40,8);
  auVar66 = vsubps_avx(auVar66,auVar67);
  auVar69 = vsubps_avx(auVar69,auVar67);
  uVar117 = *(undefined4 *)&(ray->dir).field_0;
  local_300._4_4_ = uVar117;
  local_300._0_4_ = uVar117;
  fStack_2f8 = (float)uVar117;
  fStack_2f4 = (float)uVar117;
  fStack_2f0 = (float)uVar117;
  fStack_2ec = (float)uVar117;
  fStack_2e8 = (float)uVar117;
  register0x0000151c = uVar117;
  local_600 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  local_780 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  auVar64 = vsubps_avx(auVar64,auVar67);
  auVar70 = vsubps_avx(auVar70,auVar67);
  uVar117 = auVar66._0_4_;
  local_720._4_4_ = uVar117;
  local_720._0_4_ = uVar117;
  local_720._8_4_ = uVar117;
  local_720._12_4_ = uVar117;
  local_720._16_4_ = uVar117;
  local_720._20_4_ = uVar117;
  local_720._24_4_ = uVar117;
  local_720._28_4_ = uVar117;
  auVar226 = ZEXT3264(local_720);
  auVar74._8_4_ = 1;
  auVar74._0_8_ = 0x100000001;
  auVar74._12_4_ = 1;
  auVar74._16_4_ = 1;
  auVar74._20_4_ = 1;
  auVar74._24_4_ = 1;
  auVar74._28_4_ = 1;
  local_460 = ZEXT1632(auVar66);
  local_740 = vpermps_avx2(auVar74,local_460);
  auVar228 = ZEXT3264(local_740);
  auVar75._8_4_ = 2;
  auVar75._0_8_ = 0x200000002;
  auVar75._12_4_ = 2;
  auVar75._16_4_ = 2;
  auVar75._20_4_ = 2;
  auVar75._24_4_ = 2;
  auVar75._28_4_ = 2;
  local_760 = vpermps_avx2(auVar75,local_460);
  auVar230 = ZEXT3264(local_760);
  auVar76._8_4_ = 3;
  auVar76._0_8_ = 0x300000003;
  auVar76._12_4_ = 3;
  auVar76._16_4_ = 3;
  auVar76._20_4_ = 3;
  auVar76._24_4_ = 3;
  auVar76._28_4_ = 3;
  local_900 = vpermps_avx2(auVar76,local_460);
  auVar232 = ZEXT3264(local_900);
  local_7a0 = vbroadcastss_avx512vl(auVar64);
  auVar246 = ZEXT3264(local_7a0);
  local_4a0 = ZEXT1632(auVar64);
  local_7c0 = vpermps_avx512vl(auVar74,local_4a0);
  auVar244 = ZEXT3264(local_7c0);
  local_7e0 = vpermps_avx2(auVar75,local_4a0);
  auVar235 = ZEXT3264(local_7e0);
  local_800 = vpermps_avx2(auVar76,local_4a0);
  auVar237 = ZEXT3264(local_800);
  local_820 = vbroadcastss_avx512vl(auVar69);
  auVar238 = ZEXT3264(local_820);
  local_480 = ZEXT1632(auVar69);
  local_640 = vpermps_avx512vl(auVar74,local_480);
  auVar239 = ZEXT3264(local_640);
  local_660 = vpermps_avx512vl(auVar75,local_480);
  auVar240 = ZEXT3264(local_660);
  local_840 = vpermps_avx512vl(auVar76,local_480);
  auVar241 = ZEXT3264(local_840);
  local_200 = auVar70._0_4_;
  _local_4c0 = ZEXT1632(auVar70);
  local_860 = vpermps_avx512vl(auVar74,_local_4c0);
  auVar242 = ZEXT3264(local_860);
  local_880 = vpermps_avx512vl(auVar75,_local_4c0);
  auVar243 = ZEXT3264(local_880);
  local_680 = vpermps_avx512vl(auVar76,_local_4c0);
  auVar245 = ZEXT3264(local_680);
  auVar73 = vpermps_avx512vl(auVar75,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                        CONCAT48(aVar2.z * aVar2.z,
                                                                 CONCAT44(aVar2.y * aVar2.y,
                                                                          aVar2.x * aVar2.x)))));
  auVar73 = vfmadd231ps_avx512vl(auVar73,local_600,local_600);
  local_1e0 = vfmadd231ps_avx512vl(auVar73,_local_300,_local_300);
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar73._16_4_ = 0x7fffffff;
  auVar73._20_4_ = 0x7fffffff;
  auVar73._24_4_ = 0x7fffffff;
  auVar73._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar73);
  local_958 = 1;
  uVar54 = 0;
  bVar56 = false;
  local_330 = ZEXT816(0x3f80000000000000);
  auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  local_220 = local_1e0;
  do {
    auVar66 = vmovshdup_avx(local_330);
    auVar66 = vsubps_avx(auVar66,local_330);
    fVar154 = auVar66._0_4_;
    fVar132 = fVar154 * 0.04761905;
    local_8e0._0_4_ = local_330._0_4_;
    local_8e0._4_4_ = local_8e0._0_4_;
    fStack_8d8 = (float)local_8e0._0_4_;
    fStack_8d4 = (float)local_8e0._0_4_;
    register0x000012d0 = local_8e0._0_4_;
    register0x000012d4 = local_8e0._0_4_;
    register0x000012d8 = local_8e0._0_4_;
    register0x000012dc = local_8e0._0_4_;
    auVar198._4_4_ = fVar154;
    auVar198._0_4_ = fVar154;
    auVar198._8_4_ = fVar154;
    auVar198._12_4_ = fVar154;
    register0x00001310 = fVar154;
    _local_700 = auVar198;
    register0x00001314 = fVar154;
    register0x00001318 = fVar154;
    register0x0000131c = fVar154;
    auVar66 = vfmadd231ps_fma(_local_8e0,_local_700,_DAT_01faff20);
    auVar73 = vsubps_avx(auVar219._0_32_,ZEXT1632(auVar66));
    auVar74 = vmulps_avx512vl(auVar246._0_32_,ZEXT1632(auVar66));
    auVar75 = vmulps_avx512vl(auVar244._0_32_,ZEXT1632(auVar66));
    fVar133 = auVar66._0_4_;
    fVar148 = auVar66._4_4_;
    auVar82._4_4_ = auVar235._4_4_ * fVar148;
    auVar82._0_4_ = auVar235._0_4_ * fVar133;
    fVar150 = auVar66._8_4_;
    auVar82._8_4_ = auVar235._8_4_ * fVar150;
    fVar152 = auVar66._12_4_;
    auVar82._12_4_ = auVar235._12_4_ * fVar152;
    auVar82._16_4_ = auVar235._16_4_ * 0.0;
    auVar82._20_4_ = auVar235._20_4_ * 0.0;
    auVar82._24_4_ = auVar235._24_4_ * 0.0;
    auVar82._28_4_ = fVar154;
    auVar212._0_4_ = auVar237._0_4_ * fVar133;
    auVar212._4_4_ = auVar237._4_4_ * fVar148;
    auVar212._8_4_ = auVar237._8_4_ * fVar150;
    auVar212._12_4_ = auVar237._12_4_ * fVar152;
    auVar212._16_4_ = auVar237._16_4_ * 0.0;
    auVar212._20_4_ = auVar237._20_4_ * 0.0;
    auVar212._28_36_ = auVar219._28_36_;
    auVar212._24_4_ = auVar237._24_4_ * 0.0;
    auVar64 = vfmadd231ps_fma(auVar74,auVar73,auVar226._0_32_);
    auVar69 = vfmadd231ps_fma(auVar75,auVar73,auVar228._0_32_);
    auVar70 = vfmadd231ps_fma(auVar82,auVar73,auVar230._0_32_);
    auVar67 = vfmadd231ps_fma(auVar212._0_32_,auVar73,auVar232._0_32_);
    auVar74 = vmulps_avx512vl(auVar238._0_32_,ZEXT1632(auVar66));
    auVar80 = ZEXT1632(auVar66);
    auVar75 = vmulps_avx512vl(auVar239._0_32_,auVar80);
    auVar76 = vmulps_avx512vl(auVar240._0_32_,auVar80);
    auVar77 = vmulps_avx512vl(auVar241._0_32_,auVar80);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar73,auVar246._0_32_);
    auVar75 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar244._0_32_);
    auVar71 = vfmadd231ps_fma(auVar76,auVar73,auVar235._0_32_);
    auVar68 = vfmadd231ps_fma(auVar77,auVar73,auVar237._0_32_);
    auVar219._0_4_ = local_200 * fVar133;
    auVar219._4_4_ = fStack_1fc * fVar148;
    auVar219._8_4_ = fStack_1f8 * fVar150;
    auVar219._12_4_ = fStack_1f4 * fVar152;
    auVar219._16_4_ = fStack_1f0 * 0.0;
    auVar219._20_4_ = fStack_1ec * 0.0;
    auVar219._28_36_ = auVar232._28_36_;
    auVar219._24_4_ = fStack_1e8 * 0.0;
    auVar76 = vmulps_avx512vl(auVar242._0_32_,auVar80);
    auVar77 = vmulps_avx512vl(auVar243._0_32_,auVar80);
    auVar78 = vmulps_avx512vl(auVar245._0_32_,auVar80);
    auVar79 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar73,auVar238._0_32_);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar73,auVar239._0_32_);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar73,auVar240._0_32_);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar73,auVar241._0_32_);
    auVar226._0_4_ = fVar133 * auVar74._0_4_;
    auVar226._4_4_ = fVar148 * auVar74._4_4_;
    auVar226._8_4_ = fVar150 * auVar74._8_4_;
    auVar226._12_4_ = fVar152 * auVar74._12_4_;
    auVar226._16_4_ = auVar74._16_4_ * 0.0;
    auVar226._20_4_ = auVar74._20_4_ * 0.0;
    auVar226._28_36_ = auVar237._28_36_;
    auVar226._24_4_ = auVar74._24_4_ * 0.0;
    auVar80 = vmulps_avx512vl(auVar80,auVar75);
    auVar88 = ZEXT1632(auVar66);
    auVar81 = vmulps_avx512vl(auVar88,ZEXT1632(auVar71));
    auVar82 = vmulps_avx512vl(auVar88,ZEXT1632(auVar68));
    auVar66 = vfmadd231ps_fma(auVar226._0_32_,auVar73,ZEXT1632(auVar64));
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar73,ZEXT1632(auVar69));
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar73,ZEXT1632(auVar70));
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar73,ZEXT1632(auVar67));
    auVar87._0_4_ = auVar79._0_4_ * fVar133;
    auVar87._4_4_ = auVar79._4_4_ * fVar148;
    auVar87._8_4_ = auVar79._8_4_ * fVar150;
    auVar87._12_4_ = auVar79._12_4_ * fVar152;
    auVar87._16_4_ = auVar79._16_4_ * 0.0;
    auVar87._20_4_ = auVar79._20_4_ * 0.0;
    auVar87._24_4_ = auVar79._24_4_ * 0.0;
    auVar87._28_4_ = 0;
    auVar83._4_4_ = auVar76._4_4_ * fVar148;
    auVar83._0_4_ = auVar76._0_4_ * fVar133;
    auVar83._8_4_ = auVar76._8_4_ * fVar150;
    auVar83._12_4_ = auVar76._12_4_ * fVar152;
    auVar83._16_4_ = auVar76._16_4_ * 0.0;
    auVar83._20_4_ = auVar76._20_4_ * 0.0;
    auVar83._24_4_ = auVar76._24_4_ * 0.0;
    auVar83._28_4_ = auVar79._28_4_;
    auVar84._4_4_ = auVar77._4_4_ * fVar148;
    auVar84._0_4_ = auVar77._0_4_ * fVar133;
    auVar84._8_4_ = auVar77._8_4_ * fVar150;
    auVar84._12_4_ = auVar77._12_4_ * fVar152;
    auVar84._16_4_ = auVar77._16_4_ * 0.0;
    auVar84._20_4_ = auVar77._20_4_ * 0.0;
    auVar84._24_4_ = auVar77._24_4_ * 0.0;
    auVar84._28_4_ = auVar76._28_4_;
    auVar85._4_4_ = auVar78._4_4_ * fVar148;
    auVar85._0_4_ = auVar78._0_4_ * fVar133;
    auVar85._8_4_ = auVar78._8_4_ * fVar150;
    auVar85._12_4_ = auVar78._12_4_ * fVar152;
    auVar85._16_4_ = auVar78._16_4_ * 0.0;
    auVar85._20_4_ = auVar78._20_4_ * 0.0;
    auVar85._24_4_ = auVar78._24_4_ * 0.0;
    auVar85._28_4_ = auVar77._28_4_;
    auVar64 = vfmadd231ps_fma(auVar87,auVar73,auVar74);
    auVar69 = vfmadd231ps_fma(auVar83,auVar73,auVar75);
    auVar70 = vfmadd231ps_fma(auVar84,auVar73,ZEXT1632(auVar71));
    auVar67 = vfmadd231ps_fma(auVar85,auVar73,ZEXT1632(auVar68));
    auVar74 = vmulps_avx512vl(auVar88,ZEXT1632(auVar69));
    auVar75 = vmulps_avx512vl(auVar88,ZEXT1632(auVar70));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar152 * auVar64._12_4_,
                                                 CONCAT48(fVar150 * auVar64._8_4_,
                                                          CONCAT44(fVar148 * auVar64._4_4_,
                                                                   fVar133 * auVar64._0_4_)))),
                              auVar73,ZEXT1632(auVar66));
    local_440 = vfmadd231ps_avx512vl(auVar74,auVar73,auVar80);
    local_620 = vfmadd231ps_avx512vl(auVar75,auVar73,auVar81);
    auVar75 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar67._12_4_ * fVar152,
                                            CONCAT48(auVar67._8_4_ * fVar150,
                                                     CONCAT44(auVar67._4_4_ * fVar148,
                                                              auVar67._0_4_ * fVar133)))),auVar82,
                         auVar73);
    auVar73 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar66));
    auVar74 = vsubps_avx512vl(ZEXT1632(auVar69),auVar80);
    auVar76 = vsubps_avx512vl(ZEXT1632(auVar70),auVar81);
    auVar77 = vsubps_avx512vl(ZEXT1632(auVar67),auVar82);
    auVar98._0_4_ = fVar132 * auVar73._0_4_ * 3.0;
    auVar98._4_4_ = fVar132 * auVar73._4_4_ * 3.0;
    auVar98._8_4_ = fVar132 * auVar73._8_4_ * 3.0;
    auVar98._12_4_ = fVar132 * auVar73._12_4_ * 3.0;
    auVar98._16_4_ = fVar132 * auVar73._16_4_ * 3.0;
    auVar98._20_4_ = fVar132 * auVar73._20_4_ * 3.0;
    auVar98._24_4_ = fVar132 * auVar73._24_4_ * 3.0;
    auVar98._28_4_ = 0;
    auVar99._0_4_ = fVar132 * auVar74._0_4_ * 3.0;
    auVar99._4_4_ = fVar132 * auVar74._4_4_ * 3.0;
    auVar99._8_4_ = fVar132 * auVar74._8_4_ * 3.0;
    auVar99._12_4_ = fVar132 * auVar74._12_4_ * 3.0;
    auVar99._16_4_ = fVar132 * auVar74._16_4_ * 3.0;
    auVar99._20_4_ = fVar132 * auVar74._20_4_ * 3.0;
    auVar99._24_4_ = fVar132 * auVar74._24_4_ * 3.0;
    auVar99._28_4_ = 0;
    auVar100._0_4_ = fVar132 * auVar76._0_4_ * 3.0;
    auVar100._4_4_ = fVar132 * auVar76._4_4_ * 3.0;
    auVar100._8_4_ = fVar132 * auVar76._8_4_ * 3.0;
    auVar100._12_4_ = fVar132 * auVar76._12_4_ * 3.0;
    auVar100._16_4_ = fVar132 * auVar76._16_4_ * 3.0;
    auVar100._20_4_ = fVar132 * auVar76._20_4_ * 3.0;
    auVar100._24_4_ = fVar132 * auVar76._24_4_ * 3.0;
    auVar100._28_4_ = 0;
    fVar133 = auVar77._0_4_ * 3.0 * fVar132;
    fVar148 = auVar77._4_4_ * 3.0 * fVar132;
    auVar88._4_4_ = fVar148;
    auVar88._0_4_ = fVar133;
    fVar150 = auVar77._8_4_ * 3.0 * fVar132;
    auVar88._8_4_ = fVar150;
    fVar152 = auVar77._12_4_ * 3.0 * fVar132;
    auVar88._12_4_ = fVar152;
    fVar154 = auVar77._16_4_ * 3.0 * fVar132;
    auVar88._16_4_ = fVar154;
    fVar156 = auVar77._20_4_ * 3.0 * fVar132;
    auVar88._20_4_ = fVar156;
    fVar158 = auVar77._24_4_ * 3.0 * fVar132;
    auVar88._24_4_ = fVar158;
    auVar88._28_4_ = fVar132;
    auVar66 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar66);
    auVar82 = vpermt2ps_avx512vl(ZEXT1632(auVar71),_DAT_01feed00,ZEXT1632(auVar66));
    auVar83 = vpermt2ps_avx512vl(local_440,_DAT_01feed00,ZEXT1632(auVar66));
    auVar76 = ZEXT1632(auVar66);
    auVar84 = vpermt2ps_avx512vl(local_620,_DAT_01feed00,auVar76);
    auVar86._0_4_ = auVar75._0_4_ + fVar133;
    auVar86._4_4_ = auVar75._4_4_ + fVar148;
    auVar86._8_4_ = auVar75._8_4_ + fVar150;
    auVar86._12_4_ = auVar75._12_4_ + fVar152;
    auVar86._16_4_ = auVar75._16_4_ + fVar154;
    auVar86._20_4_ = auVar75._20_4_ + fVar156;
    auVar86._24_4_ = auVar75._24_4_ + fVar158;
    auVar86._28_4_ = auVar75._28_4_ + fVar132;
    auVar73 = vmaxps_avx(auVar75,auVar86);
    auVar74 = vminps_avx(auVar75,auVar86);
    auVar77 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar76);
    auVar85 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,auVar76);
    auVar86 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar76);
    auVar101 = ZEXT1632(auVar66);
    auVar87 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,auVar101);
    auVar75 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar101);
    auVar75 = vsubps_avx(auVar77,auVar75);
    auVar76 = vsubps_avx(auVar82,ZEXT1632(auVar71));
    auVar88 = vsubps_avx512vl(auVar83,local_440);
    auVar89 = vsubps_avx512vl(auVar84,local_620);
    auVar78 = vmulps_avx512vl(auVar88,auVar100);
    auVar78 = vfmsub231ps_avx512vl(auVar78,auVar99,auVar89);
    auVar79 = vmulps_avx512vl(auVar89,auVar98);
    auVar79 = vfmsub231ps_avx512vl(auVar79,auVar100,auVar76);
    auVar80 = vmulps_avx512vl(auVar76,auVar99);
    auVar80 = vfmsub231ps_avx512vl(auVar80,auVar98,auVar88);
    auVar80 = vmulps_avx512vl(auVar80,auVar80);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar79,auVar79);
    auVar78 = vfmadd231ps_avx512vl(auVar79,auVar78,auVar78);
    auVar79 = vmulps_avx512vl(auVar89,auVar89);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar88,auVar88);
    auVar80 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar76);
    auVar79 = vrcp14ps_avx512vl(auVar80);
    auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar81 = vfnmadd213ps_avx512vl(auVar79,auVar80,auVar90);
    auVar79 = vfmadd132ps_avx512vl(auVar81,auVar79,auVar79);
    auVar78 = vmulps_avx512vl(auVar78,auVar79);
    auVar81 = vmulps_avx512vl(auVar88,auVar87);
    auVar81 = vfmsub231ps_avx512vl(auVar81,auVar86,auVar89);
    auVar91 = vmulps_avx512vl(auVar89,auVar85);
    auVar91 = vfmsub231ps_avx512vl(auVar91,auVar87,auVar76);
    auVar92 = vmulps_avx512vl(auVar76,auVar86);
    auVar92 = vfmsub231ps_avx512vl(auVar92,auVar85,auVar88);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar91 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar91);
    auVar81 = vfmadd231ps_avx512vl(auVar91,auVar81,auVar81);
    auVar79 = vmulps_avx512vl(auVar81,auVar79);
    auVar78 = vmaxps_avx512vl(auVar78,auVar79);
    auVar78 = vsqrtps_avx512vl(auVar78);
    auVar79 = vmaxps_avx512vl(auVar75,auVar77);
    auVar73 = vmaxps_avx512vl(auVar73,auVar79);
    auVar81 = vaddps_avx512vl(auVar78,auVar73);
    auVar73 = vminps_avx(auVar75,auVar77);
    auVar73 = vminps_avx(auVar74,auVar73);
    auVar73 = vsubps_avx512vl(auVar73,auVar78);
    auVar77._8_4_ = 0x3f800002;
    auVar77._0_8_ = 0x3f8000023f800002;
    auVar77._12_4_ = 0x3f800002;
    auVar77._16_4_ = 0x3f800002;
    auVar77._20_4_ = 0x3f800002;
    auVar77._24_4_ = 0x3f800002;
    auVar77._28_4_ = 0x3f800002;
    auVar74 = vmulps_avx512vl(auVar81,auVar77);
    auVar78._8_4_ = 0x3f7ffffc;
    auVar78._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar78._12_4_ = 0x3f7ffffc;
    auVar78._16_4_ = 0x3f7ffffc;
    auVar78._20_4_ = 0x3f7ffffc;
    auVar78._24_4_ = 0x3f7ffffc;
    auVar78._28_4_ = 0x3f7ffffc;
    local_5e0 = vmulps_avx512vl(auVar73,auVar78);
    auVar73 = vmulps_avx512vl(auVar74,auVar74);
    auVar74 = vrsqrt14ps_avx512vl(auVar80);
    auVar79._8_4_ = 0xbf000000;
    auVar79._0_8_ = 0xbf000000bf000000;
    auVar79._12_4_ = 0xbf000000;
    auVar79._16_4_ = 0xbf000000;
    auVar79._20_4_ = 0xbf000000;
    auVar79._24_4_ = 0xbf000000;
    auVar79._28_4_ = 0xbf000000;
    auVar75 = vmulps_avx512vl(auVar80,auVar79);
    fVar133 = auVar74._0_4_;
    fVar148 = auVar74._4_4_;
    fVar150 = auVar74._8_4_;
    fVar152 = auVar74._12_4_;
    fVar132 = auVar74._16_4_;
    fVar154 = auVar74._20_4_;
    fVar156 = auVar74._24_4_;
    auVar91._4_4_ = fVar148 * fVar148 * fVar148 * auVar75._4_4_;
    auVar91._0_4_ = fVar133 * fVar133 * fVar133 * auVar75._0_4_;
    auVar91._8_4_ = fVar150 * fVar150 * fVar150 * auVar75._8_4_;
    auVar91._12_4_ = fVar152 * fVar152 * fVar152 * auVar75._12_4_;
    auVar91._16_4_ = fVar132 * fVar132 * fVar132 * auVar75._16_4_;
    auVar91._20_4_ = fVar154 * fVar154 * fVar154 * auVar75._20_4_;
    auVar91._24_4_ = fVar156 * fVar156 * fVar156 * auVar75._24_4_;
    auVar91._28_4_ = auVar81._28_4_;
    auVar80._8_4_ = 0x3fc00000;
    auVar80._0_8_ = 0x3fc000003fc00000;
    auVar80._12_4_ = 0x3fc00000;
    auVar80._16_4_ = 0x3fc00000;
    auVar80._20_4_ = 0x3fc00000;
    auVar80._24_4_ = 0x3fc00000;
    auVar80._28_4_ = 0x3fc00000;
    auVar74 = vfmadd231ps_avx512vl(auVar91,auVar74,auVar80);
    auVar75 = vmulps_avx512vl(auVar76,auVar74);
    auVar77 = vmulps_avx512vl(auVar88,auVar74);
    auVar78 = vmulps_avx512vl(auVar89,auVar74);
    auVar178 = ZEXT1632(auVar71);
    auVar79 = vsubps_avx512vl(auVar101,auVar178);
    auVar80 = vsubps_avx512vl(auVar101,local_440);
    auVar91 = vsubps_avx512vl(auVar101,local_620);
    auVar81 = vmulps_avx512vl(local_780,auVar91);
    auVar81 = vfmadd231ps_avx512vl(auVar81,local_600,auVar80);
    auVar81 = vfmadd231ps_avx512vl(auVar81,_local_300,auVar79);
    auVar92 = vmulps_avx512vl(auVar91,auVar91);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar80,auVar80);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar79,auVar79);
    auVar93 = vmulps_avx512vl(local_780,auVar78);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar77,local_600);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar75,_local_300);
    auVar78 = vmulps_avx512vl(auVar91,auVar78);
    auVar77 = vfmadd231ps_avx512vl(auVar78,auVar80,auVar77);
    auVar75 = vfmadd231ps_avx512vl(auVar77,auVar79,auVar75);
    auVar77 = vmulps_avx512vl(auVar93,auVar93);
    auVar78 = vsubps_avx512vl(local_220,auVar77);
    auVar94 = vmulps_avx512vl(auVar93,auVar75);
    auVar81 = vsubps_avx512vl(auVar81,auVar94);
    auVar94 = vaddps_avx512vl(auVar81,auVar81);
    auVar81 = vmulps_avx512vl(auVar75,auVar75);
    local_540 = vsubps_avx512vl(auVar92,auVar81);
    auVar73 = vsubps_avx512vl(local_540,auVar73);
    local_3a0 = vmulps_avx512vl(auVar94,auVar94);
    auVar81._8_4_ = 0x40800000;
    auVar81._0_8_ = 0x4080000040800000;
    auVar81._12_4_ = 0x40800000;
    auVar81._16_4_ = 0x40800000;
    auVar81._20_4_ = 0x40800000;
    auVar81._24_4_ = 0x40800000;
    auVar81._28_4_ = 0x40800000;
    _local_3c0 = vmulps_avx512vl(auVar78,auVar81);
    auVar81 = vmulps_avx512vl(_local_3c0,auVar73);
    auVar81 = vsubps_avx512vl(local_3a0,auVar81);
    uVar55 = vcmpps_avx512vl(auVar81,auVar101,5);
    bVar50 = (byte)uVar55;
    fVar133 = (float)local_940._0_4_;
    fVar148 = (float)local_940._4_4_;
    fVar150 = fStack_938;
    fVar152 = fStack_934;
    fVar132 = fStack_930;
    fVar154 = fStack_92c;
    fVar156 = fStack_928;
    fVar158 = fStack_924;
    if (bVar50 == 0) {
LAB_01af000b:
      auVar219 = ZEXT3264(auVar90);
      auVar226 = ZEXT3264(local_720);
      auVar228 = ZEXT3264(local_740);
      auVar230 = ZEXT3264(local_760);
      auVar232 = ZEXT3264(local_900);
      auVar246 = ZEXT3264(local_7a0);
      auVar244 = ZEXT3264(local_7c0);
      auVar235 = ZEXT3264(local_7e0);
      auVar237 = ZEXT3264(local_800);
      auVar238 = ZEXT3264(local_820);
      auVar239 = ZEXT3264(local_640);
      auVar240 = ZEXT3264(local_660);
      auVar241 = ZEXT3264(local_840);
      auVar242 = ZEXT3264(local_860);
      auVar243 = ZEXT3264(local_880);
      auVar245 = ZEXT3264(local_680);
    }
    else {
      auVar130 = _local_3c0;
      auVar81 = vsqrtps_avx512vl(auVar81);
      auVar95 = vaddps_avx512vl(auVar78,auVar78);
      local_420 = vrcp14ps_avx512vl(auVar95);
      in_ZMM31 = ZEXT3264(local_420);
      auVar90 = vfnmadd213ps_avx512vl(local_420,auVar95,auVar90);
      auVar90 = vfmadd132ps_avx512vl(auVar90,local_420,local_420);
      auVar92._8_4_ = 0x80000000;
      auVar92._0_8_ = 0x8000000080000000;
      auVar92._12_4_ = 0x80000000;
      auVar92._16_4_ = 0x80000000;
      auVar92._20_4_ = 0x80000000;
      auVar92._24_4_ = 0x80000000;
      auVar92._28_4_ = 0x80000000;
      local_3e0 = vxorps_avx512vl(auVar94,auVar92);
      auVar92 = vsubps_avx512vl(local_3e0,auVar81);
      local_560 = vmulps_avx512vl(auVar92,auVar90);
      auVar81 = vsubps_avx512vl(auVar81,auVar94);
      local_580 = vmulps_avx512vl(auVar81,auVar90);
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar81 = vblendmps_avx512vl(auVar81,local_560);
      auVar96._0_4_ = (uint)(bVar50 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar90._0_4_
      ;
      bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar96._4_4_ = (uint)bVar58 * auVar81._4_4_ | (uint)!bVar58 * auVar90._4_4_;
      bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar96._8_4_ = (uint)bVar58 * auVar81._8_4_ | (uint)!bVar58 * auVar90._8_4_;
      bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar96._12_4_ = (uint)bVar58 * auVar81._12_4_ | (uint)!bVar58 * auVar90._12_4_;
      bVar58 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar96._16_4_ = (uint)bVar58 * auVar81._16_4_ | (uint)!bVar58 * auVar90._16_4_;
      bVar58 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar96._20_4_ = (uint)bVar58 * auVar81._20_4_ | (uint)!bVar58 * auVar90._20_4_;
      bVar58 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar96._24_4_ = (uint)bVar58 * auVar81._24_4_ | (uint)!bVar58 * auVar90._24_4_;
      bVar58 = SUB81(uVar55 >> 7,0);
      auVar96._28_4_ = (uint)bVar58 * auVar81._28_4_ | (uint)!bVar58 * auVar90._28_4_;
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar90 = vblendmps_avx512vl(auVar81,local_580);
      auVar97._0_4_ = (uint)(bVar50 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar81._0_4_
      ;
      bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar97._4_4_ = (uint)bVar58 * auVar90._4_4_ | (uint)!bVar58 * auVar81._4_4_;
      bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar97._8_4_ = (uint)bVar58 * auVar90._8_4_ | (uint)!bVar58 * auVar81._8_4_;
      bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar97._12_4_ = (uint)bVar58 * auVar90._12_4_ | (uint)!bVar58 * auVar81._12_4_;
      bVar58 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar97._16_4_ = (uint)bVar58 * auVar90._16_4_ | (uint)!bVar58 * auVar81._16_4_;
      bVar58 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar97._20_4_ = (uint)bVar58 * auVar90._20_4_ | (uint)!bVar58 * auVar81._20_4_;
      bVar58 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar97._24_4_ = (uint)bVar58 * auVar90._24_4_ | (uint)!bVar58 * auVar81._24_4_;
      bVar58 = SUB81(uVar55 >> 7,0);
      auVar97._28_4_ = (uint)bVar58 * auVar90._28_4_ | (uint)!bVar58 * auVar81._28_4_;
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar77,auVar81);
      auVar77 = vmaxps_avx512vl(local_1e0,auVar81);
      auVar101._8_4_ = 0x36000000;
      auVar101._0_8_ = 0x3600000036000000;
      auVar101._12_4_ = 0x36000000;
      auVar101._16_4_ = 0x36000000;
      auVar101._20_4_ = 0x36000000;
      auVar101._24_4_ = 0x36000000;
      auVar101._28_4_ = 0x36000000;
      local_400 = vmulps_avx512vl(auVar77,auVar101);
      vandps_avx512vl(auVar78,auVar81);
      uVar60 = vcmpps_avx512vl(local_400,local_400,1);
      uVar55 = uVar55 & uVar60;
      bVar53 = (byte)uVar55;
      if (bVar53 != 0) {
        uVar60 = vcmpps_avx512vl(auVar73,_DAT_01faff00,2);
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar78 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar81 = vblendmps_avx512vl(auVar73,auVar78);
        bVar52 = (byte)uVar60;
        uVar61 = (uint)(bVar52 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar52 & 1) * local_400._0_4_;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar110 = (uint)bVar58 * auVar81._4_4_ | (uint)!bVar58 * local_400._4_4_;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar111 = (uint)bVar58 * auVar81._8_4_ | (uint)!bVar58 * local_400._8_4_;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar112 = (uint)bVar58 * auVar81._12_4_ | (uint)!bVar58 * local_400._12_4_;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar113 = (uint)bVar58 * auVar81._16_4_ | (uint)!bVar58 * local_400._16_4_;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar114 = (uint)bVar58 * auVar81._20_4_ | (uint)!bVar58 * local_400._20_4_;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar115 = (uint)bVar58 * auVar81._24_4_ | (uint)!bVar58 * local_400._24_4_;
        bVar58 = SUB81(uVar60 >> 7,0);
        uVar116 = (uint)bVar58 * auVar81._28_4_ | (uint)!bVar58 * local_400._28_4_;
        auVar96._0_4_ = (bVar53 & 1) * uVar61 | !(bool)(bVar53 & 1) * auVar96._0_4_;
        bVar58 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar96._4_4_ = bVar58 * uVar110 | !bVar58 * auVar96._4_4_;
        bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar96._8_4_ = bVar58 * uVar111 | !bVar58 * auVar96._8_4_;
        bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar96._12_4_ = bVar58 * uVar112 | !bVar58 * auVar96._12_4_;
        bVar58 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar96._16_4_ = bVar58 * uVar113 | !bVar58 * auVar96._16_4_;
        bVar58 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar96._20_4_ = bVar58 * uVar114 | !bVar58 * auVar96._20_4_;
        bVar58 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar96._24_4_ = bVar58 * uVar115 | !bVar58 * auVar96._24_4_;
        bVar58 = SUB81(uVar55 >> 7,0);
        auVar96._28_4_ = bVar58 * uVar116 | !bVar58 * auVar96._28_4_;
        auVar73 = vblendmps_avx512vl(auVar78,auVar73);
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar12 = SUB81(uVar60 >> 7,0);
        auVar97._0_4_ =
             (uint)(bVar53 & 1) *
             ((uint)(bVar52 & 1) * auVar73._0_4_ | !(bool)(bVar52 & 1) * uVar61) |
             !(bool)(bVar53 & 1) * auVar97._0_4_;
        bVar6 = (bool)((byte)(uVar55 >> 1) & 1);
        auVar97._4_4_ =
             (uint)bVar6 * ((uint)bVar58 * auVar73._4_4_ | !bVar58 * uVar110) |
             !bVar6 * auVar97._4_4_;
        bVar58 = (bool)((byte)(uVar55 >> 2) & 1);
        auVar97._8_4_ =
             (uint)bVar58 * ((uint)bVar7 * auVar73._8_4_ | !bVar7 * uVar111) |
             !bVar58 * auVar97._8_4_;
        bVar58 = (bool)((byte)(uVar55 >> 3) & 1);
        auVar97._12_4_ =
             (uint)bVar58 * ((uint)bVar8 * auVar73._12_4_ | !bVar8 * uVar112) |
             !bVar58 * auVar97._12_4_;
        bVar58 = (bool)((byte)(uVar55 >> 4) & 1);
        auVar97._16_4_ =
             (uint)bVar58 * ((uint)bVar9 * auVar73._16_4_ | !bVar9 * uVar113) |
             !bVar58 * auVar97._16_4_;
        bVar58 = (bool)((byte)(uVar55 >> 5) & 1);
        auVar97._20_4_ =
             (uint)bVar58 * ((uint)bVar10 * auVar73._20_4_ | !bVar10 * uVar114) |
             !bVar58 * auVar97._20_4_;
        bVar58 = (bool)((byte)(uVar55 >> 6) & 1);
        auVar97._24_4_ =
             (uint)bVar58 * ((uint)bVar11 * auVar73._24_4_ | !bVar11 * uVar115) |
             !bVar58 * auVar97._24_4_;
        bVar58 = SUB81(uVar55 >> 7,0);
        auVar97._28_4_ =
             (uint)bVar58 * ((uint)bVar12 * auVar73._28_4_ | !bVar12 * uVar116) |
             !bVar58 * auVar97._28_4_;
        bVar50 = (~bVar53 | bVar52) & bVar50;
      }
      if ((bVar50 & 0x7f) == 0) {
        auVar90._8_4_ = 0x3f800000;
        auVar90._0_8_ = 0x3f8000003f800000;
        auVar90._12_4_ = 0x3f800000;
        auVar90._16_4_ = 0x3f800000;
        auVar90._20_4_ = 0x3f800000;
        auVar90._24_4_ = 0x3f800000;
        auVar90._28_4_ = 0x3f800000;
        goto LAB_01af000b;
      }
      auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar87 = vxorps_avx512vl(auVar87,auVar81);
      auVar85 = vxorps_avx512vl(auVar85,auVar81);
      auVar86 = vxorps_avx512vl(auVar86,auVar81);
      auVar66 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_520);
      auVar73 = vbroadcastss_avx512vl(auVar66);
      auVar73 = vmaxps_avx512vl(auVar73,auVar96);
      auVar66 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_520);
      auVar78 = vbroadcastss_avx512vl(auVar66);
      auVar78 = vminps_avx512vl(auVar78,auVar97);
      auVar91 = vmulps_avx512vl(auVar91,auVar100);
      auVar80 = vfmadd213ps_avx512vl(auVar80,auVar99,auVar91);
      auVar66 = vfmadd213ps_fma(auVar79,auVar98,auVar80);
      in_ZMM31 = ZEXT3264(local_780);
      auVar79 = vmulps_avx512vl(local_780,auVar100);
      auVar79 = vfmadd231ps_avx512vl(auVar79,local_600,auVar99);
      auVar79 = vfmadd231ps_avx512vl(auVar79,_local_300,auVar98);
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar79,auVar80);
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar80,auVar91,1);
      auVar92 = vxorps_avx512vl(ZEXT1632(auVar66),auVar81);
      auVar98 = vrcp14ps_avx512vl(auVar79);
      auVar99 = vxorps_avx512vl(auVar79,auVar81);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar100 = vfnmadd213ps_avx512vl(auVar98,auVar79,auVar90);
      auVar66 = vfmadd132ps_fma(auVar100,auVar98,auVar98);
      fVar134 = auVar66._0_4_ * auVar92._0_4_;
      fVar149 = auVar66._4_4_ * auVar92._4_4_;
      auVar34._4_4_ = fVar149;
      auVar34._0_4_ = fVar134;
      fVar151 = auVar66._8_4_ * auVar92._8_4_;
      auVar34._8_4_ = fVar151;
      fVar153 = auVar66._12_4_ * auVar92._12_4_;
      auVar34._12_4_ = fVar153;
      fVar155 = auVar92._16_4_ * 0.0;
      auVar34._16_4_ = fVar155;
      fVar157 = auVar92._20_4_ * 0.0;
      auVar34._20_4_ = fVar157;
      fVar159 = auVar92._24_4_ * 0.0;
      auVar34._24_4_ = fVar159;
      auVar34._28_4_ = auVar92._28_4_;
      uVar16 = vcmpps_avx512vl(auVar79,auVar99,1);
      bVar53 = (byte)uVar15 | (byte)uVar16;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar101 = vblendmps_avx512vl(auVar34,auVar100);
      auVar102._0_4_ =
           (uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar98._0_4_;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar102._4_4_ = (uint)bVar58 * auVar101._4_4_ | (uint)!bVar58 * auVar98._4_4_;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar102._8_4_ = (uint)bVar58 * auVar101._8_4_ | (uint)!bVar58 * auVar98._8_4_;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar102._12_4_ = (uint)bVar58 * auVar101._12_4_ | (uint)!bVar58 * auVar98._12_4_;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar102._16_4_ = (uint)bVar58 * auVar101._16_4_ | (uint)!bVar58 * auVar98._16_4_;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar102._20_4_ = (uint)bVar58 * auVar101._20_4_ | (uint)!bVar58 * auVar98._20_4_;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar102._24_4_ = (uint)bVar58 * auVar101._24_4_ | (uint)!bVar58 * auVar98._24_4_;
      auVar102._28_4_ =
           (uint)(bVar53 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar98._28_4_;
      auVar98 = vmaxps_avx512vl(auVar73,auVar102);
      uVar16 = vcmpps_avx512vl(auVar79,auVar99,6);
      bVar53 = (byte)uVar15 | (byte)uVar16;
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar103._0_4_ = (uint)(bVar53 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)fVar134
      ;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar103._4_4_ = (uint)bVar58 * auVar99._4_4_ | (uint)!bVar58 * (int)fVar149;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar103._8_4_ = (uint)bVar58 * auVar99._8_4_ | (uint)!bVar58 * (int)fVar151;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar103._12_4_ = (uint)bVar58 * auVar99._12_4_ | (uint)!bVar58 * (int)fVar153;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar103._16_4_ = (uint)bVar58 * auVar99._16_4_ | (uint)!bVar58 * (int)fVar155;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar103._20_4_ = (uint)bVar58 * auVar99._20_4_ | (uint)!bVar58 * (int)fVar157;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar103._24_4_ = (uint)bVar58 * auVar99._24_4_ | (uint)!bVar58 * (int)fVar159;
      auVar103._28_4_ =
           (uint)(bVar53 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar92._28_4_;
      auVar92 = vminps_avx512vl(auVar78,auVar103);
      auVar73 = vsubps_avx(ZEXT832(0) << 0x20,auVar82);
      auVar78 = vsubps_avx(ZEXT832(0) << 0x20,auVar83);
      auVar82 = ZEXT832(0) << 0x20;
      auVar79 = vsubps_avx(auVar82,auVar84);
      auVar79 = vmulps_avx512vl(auVar79,auVar87);
      auVar78 = vfmadd231ps_avx512vl(auVar79,auVar86,auVar78);
      auVar66 = vfmadd231ps_fma(auVar78,auVar85,auVar73);
      auVar73 = vmulps_avx512vl(local_780,auVar87);
      auVar73 = vfmadd231ps_avx512vl(auVar73,local_600,auVar86);
      auVar73 = vfmadd231ps_avx512vl(auVar73,_local_300,auVar85);
      vandps_avx512vl(auVar73,auVar80);
      uVar15 = vcmpps_avx512vl(auVar73,auVar91,1);
      auVar78 = vxorps_avx512vl(ZEXT1632(auVar66),auVar81);
      auVar79 = vrcp14ps_avx512vl(auVar73);
      auVar80 = vxorps_avx512vl(auVar73,auVar81);
      auVar81 = vfnmadd213ps_avx512vl(auVar79,auVar73,auVar90);
      auVar66 = vfmadd132ps_fma(auVar81,auVar79,auVar79);
      fVar134 = auVar66._0_4_ * auVar78._0_4_;
      fVar149 = auVar66._4_4_ * auVar78._4_4_;
      auVar35._4_4_ = fVar149;
      auVar35._0_4_ = fVar134;
      fVar151 = auVar66._8_4_ * auVar78._8_4_;
      auVar35._8_4_ = fVar151;
      fVar153 = auVar66._12_4_ * auVar78._12_4_;
      auVar35._12_4_ = fVar153;
      fVar155 = auVar78._16_4_ * 0.0;
      auVar35._16_4_ = fVar155;
      fVar157 = auVar78._20_4_ * 0.0;
      auVar35._20_4_ = fVar157;
      fVar159 = auVar78._24_4_ * 0.0;
      auVar35._24_4_ = fVar159;
      auVar35._28_4_ = auVar78._28_4_;
      uVar16 = vcmpps_avx512vl(auVar73,auVar80,1);
      bVar53 = (byte)uVar15 | (byte)uVar16;
      auVar81 = vblendmps_avx512vl(auVar35,auVar100);
      auVar104._0_4_ =
           (uint)(bVar53 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar79._0_4_;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar104._4_4_ = (uint)bVar58 * auVar81._4_4_ | (uint)!bVar58 * auVar79._4_4_;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar104._8_4_ = (uint)bVar58 * auVar81._8_4_ | (uint)!bVar58 * auVar79._8_4_;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar104._12_4_ = (uint)bVar58 * auVar81._12_4_ | (uint)!bVar58 * auVar79._12_4_;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar104._16_4_ = (uint)bVar58 * auVar81._16_4_ | (uint)!bVar58 * auVar79._16_4_;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar104._20_4_ = (uint)bVar58 * auVar81._20_4_ | (uint)!bVar58 * auVar79._20_4_;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar104._24_4_ = (uint)bVar58 * auVar81._24_4_ | (uint)!bVar58 * auVar79._24_4_;
      auVar104._28_4_ =
           (uint)(bVar53 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar79._28_4_;
      _local_6a0 = vmaxps_avx(auVar98,auVar104);
      uVar16 = vcmpps_avx512vl(auVar73,auVar80,6);
      bVar53 = (byte)uVar15 | (byte)uVar16;
      auVar105._0_4_ = (uint)(bVar53 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)fVar134
      ;
      bVar58 = (bool)(bVar53 >> 1 & 1);
      auVar105._4_4_ = (uint)bVar58 * auVar99._4_4_ | (uint)!bVar58 * (int)fVar149;
      bVar58 = (bool)(bVar53 >> 2 & 1);
      auVar105._8_4_ = (uint)bVar58 * auVar99._8_4_ | (uint)!bVar58 * (int)fVar151;
      bVar58 = (bool)(bVar53 >> 3 & 1);
      auVar105._12_4_ = (uint)bVar58 * auVar99._12_4_ | (uint)!bVar58 * (int)fVar153;
      bVar58 = (bool)(bVar53 >> 4 & 1);
      auVar105._16_4_ = (uint)bVar58 * auVar99._16_4_ | (uint)!bVar58 * (int)fVar155;
      bVar58 = (bool)(bVar53 >> 5 & 1);
      auVar105._20_4_ = (uint)bVar58 * auVar99._20_4_ | (uint)!bVar58 * (int)fVar157;
      bVar58 = (bool)(bVar53 >> 6 & 1);
      auVar105._24_4_ = (uint)bVar58 * auVar99._24_4_ | (uint)!bVar58 * (int)fVar159;
      auVar105._28_4_ =
           (uint)(bVar53 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar53 >> 7) * auVar78._28_4_;
      local_2c0 = vminps_avx(auVar92,auVar105);
      auVar73 = _local_6a0;
      uVar15 = vcmpps_avx512vl(_local_6a0,local_2c0,2);
      bVar50 = bVar50 & 0x7f & (byte)uVar15;
      if (bVar50 == 0) goto LAB_01af000b;
      auVar78 = vmaxps_avx(auVar82,local_5e0);
      auVar79 = vfmadd213ps_avx512vl(local_560,auVar93,auVar75);
      fVar134 = auVar74._0_4_;
      fVar149 = auVar74._4_4_;
      auVar36._4_4_ = fVar149 * auVar79._4_4_;
      auVar36._0_4_ = fVar134 * auVar79._0_4_;
      fVar151 = auVar74._8_4_;
      auVar36._8_4_ = fVar151 * auVar79._8_4_;
      fVar153 = auVar74._12_4_;
      auVar36._12_4_ = fVar153 * auVar79._12_4_;
      fVar155 = auVar74._16_4_;
      auVar36._16_4_ = fVar155 * auVar79._16_4_;
      fVar157 = auVar74._20_4_;
      auVar36._20_4_ = fVar157 * auVar79._20_4_;
      fVar159 = auVar74._24_4_;
      auVar36._24_4_ = fVar159 * auVar79._24_4_;
      auVar36._28_4_ = auVar79._28_4_;
      auVar79 = vfmadd213ps_avx512vl(local_580,auVar93,auVar75);
      auVar37._4_4_ = fVar149 * auVar79._4_4_;
      auVar37._0_4_ = fVar134 * auVar79._0_4_;
      auVar37._8_4_ = fVar151 * auVar79._8_4_;
      auVar37._12_4_ = fVar153 * auVar79._12_4_;
      auVar37._16_4_ = fVar155 * auVar79._16_4_;
      auVar37._20_4_ = fVar157 * auVar79._20_4_;
      auVar37._24_4_ = fVar159 * auVar79._24_4_;
      auVar37._28_4_ = auVar79._28_4_;
      auVar79 = vminps_avx512vl(auVar36,auVar90);
      auVar80 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar79 = vmaxps_avx(auVar79,ZEXT832(0) << 0x20);
      auVar81 = vminps_avx512vl(auVar37,auVar90);
      auVar38._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar79._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar38,_local_700,_local_8e0);
      auVar79 = vmaxps_avx(auVar81,ZEXT832(0) << 0x20);
      auVar39._4_4_ = (auVar79._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar79._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar79._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar79._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar79._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar79._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar79._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar79._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar39,_local_700,_local_8e0);
      auVar40._4_4_ = auVar78._4_4_ * auVar78._4_4_;
      auVar40._0_4_ = auVar78._0_4_ * auVar78._0_4_;
      auVar40._8_4_ = auVar78._8_4_ * auVar78._8_4_;
      auVar40._12_4_ = auVar78._12_4_ * auVar78._12_4_;
      auVar40._16_4_ = auVar78._16_4_ * auVar78._16_4_;
      auVar40._20_4_ = auVar78._20_4_ * auVar78._20_4_;
      auVar40._24_4_ = auVar78._24_4_ * auVar78._24_4_;
      auVar40._28_4_ = auVar78._28_4_;
      auVar79 = vsubps_avx(local_540,auVar40);
      auVar41._4_4_ = auVar79._4_4_ * (float)local_3c0._4_4_;
      auVar41._0_4_ = auVar79._0_4_ * (float)local_3c0._0_4_;
      auVar41._8_4_ = auVar79._8_4_ * fStack_3b8;
      auVar41._12_4_ = auVar79._12_4_ * fStack_3b4;
      auVar41._16_4_ = auVar79._16_4_ * fStack_3b0;
      auVar41._20_4_ = auVar79._20_4_ * fStack_3ac;
      auVar41._24_4_ = auVar79._24_4_ * fStack_3a8;
      auVar41._28_4_ = auVar78._28_4_;
      auVar78 = vsubps_avx(local_3a0,auVar41);
      uVar55 = vcmpps_avx512vl(auVar78,ZEXT832(0) << 0x20,5);
      auVar245 = ZEXT3264(local_680);
      if ((byte)uVar55 == 0) {
        uVar55 = 0;
        auVar74 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar219 = ZEXT864(0) << 0x20;
        auVar78 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar81 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar227 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar89._8_4_ = 0x7f800000;
        auVar89._0_8_ = 0x7f8000007f800000;
        auVar89._12_4_ = 0x7f800000;
        auVar89._16_4_ = 0x7f800000;
        auVar89._20_4_ = 0x7f800000;
        auVar89._24_4_ = 0x7f800000;
        auVar89._28_4_ = 0x7f800000;
        auVar93._8_4_ = 0xff800000;
        auVar93._0_8_ = 0xff800000ff800000;
        auVar93._12_4_ = 0xff800000;
        auVar93._16_4_ = 0xff800000;
        auVar93._20_4_ = 0xff800000;
        auVar93._24_4_ = 0xff800000;
        auVar93._28_4_ = 0xff800000;
      }
      else {
        auVar64 = vxorps_avx512vl(auVar198,auVar198);
        uVar60 = vcmpps_avx512vl(auVar78,auVar82,5);
        auVar78 = vsqrtps_avx(auVar78);
        auVar80 = vfnmadd213ps_avx512vl(auVar95,local_420,auVar90);
        auVar82 = vfmadd132ps_avx512vl(auVar80,local_420,local_420);
        auVar80 = vsubps_avx(local_3e0,auVar78);
        auVar83 = vmulps_avx512vl(auVar80,auVar82);
        auVar78 = vsubps_avx512vl(auVar78,auVar94);
        auVar82 = vmulps_avx512vl(auVar78,auVar82);
        auVar78 = vfmadd213ps_avx512vl(auVar93,auVar83,auVar75);
        auVar95._4_4_ = fVar149 * auVar78._4_4_;
        auVar95._0_4_ = fVar134 * auVar78._0_4_;
        auVar95._8_4_ = fVar151 * auVar78._8_4_;
        auVar95._12_4_ = fVar153 * auVar78._12_4_;
        auVar95._16_4_ = fVar155 * auVar78._16_4_;
        auVar95._20_4_ = fVar157 * auVar78._20_4_;
        auVar95._24_4_ = fVar159 * auVar78._24_4_;
        auVar95._28_4_ = auVar81._28_4_;
        auVar42._4_4_ = auVar83._4_4_ * (float)local_300._4_4_;
        auVar42._0_4_ = auVar83._0_4_ * (float)local_300._0_4_;
        auVar42._8_4_ = auVar83._8_4_ * fStack_2f8;
        auVar42._12_4_ = auVar83._12_4_ * fStack_2f4;
        auVar42._16_4_ = auVar83._16_4_ * fStack_2f0;
        auVar42._20_4_ = auVar83._20_4_ * fStack_2ec;
        auVar42._24_4_ = auVar83._24_4_ * fStack_2e8;
        auVar42._28_4_ = auVar78._28_4_;
        auVar80 = vmulps_avx512vl(local_600,auVar83);
        auVar84 = vmulps_avx512vl(local_780,auVar83);
        auVar78 = vfmadd213ps_avx512vl(auVar76,auVar95,auVar178);
        auVar78 = vsubps_avx512vl(auVar42,auVar78);
        auVar81 = vfmadd213ps_avx512vl(auVar88,auVar95,local_440);
        auVar81 = vsubps_avx512vl(auVar80,auVar81);
        auVar66 = vfmadd213ps_fma(auVar95,auVar89,local_620);
        auVar80 = vsubps_avx(auVar84,ZEXT1632(auVar66));
        auVar227 = auVar80._0_28_;
        auVar75 = vfmadd213ps_avx512vl(auVar93,auVar82,auVar75);
        auVar43._4_4_ = fVar149 * auVar75._4_4_;
        auVar43._0_4_ = fVar134 * auVar75._0_4_;
        auVar43._8_4_ = fVar151 * auVar75._8_4_;
        auVar43._12_4_ = fVar153 * auVar75._12_4_;
        auVar43._16_4_ = fVar155 * auVar75._16_4_;
        auVar43._20_4_ = fVar157 * auVar75._20_4_;
        auVar43._24_4_ = fVar159 * auVar75._24_4_;
        auVar43._28_4_ = auVar74._28_4_;
        auVar44._4_4_ = auVar82._4_4_ * (float)local_300._4_4_;
        auVar44._0_4_ = auVar82._0_4_ * (float)local_300._0_4_;
        auVar44._8_4_ = auVar82._8_4_ * fStack_2f8;
        auVar44._12_4_ = auVar82._12_4_ * fStack_2f4;
        auVar44._16_4_ = auVar82._16_4_ * fStack_2f0;
        auVar44._20_4_ = auVar82._20_4_ * fStack_2ec;
        auVar44._24_4_ = auVar82._24_4_ * fStack_2e8;
        auVar44._28_4_ = auVar84._28_4_;
        auVar74 = vmulps_avx512vl(local_600,auVar82);
        auVar75 = vmulps_avx512vl(local_780,auVar82);
        auVar66 = vfmadd213ps_fma(auVar76,auVar43,auVar178);
        auVar80 = vsubps_avx(auVar44,ZEXT1632(auVar66));
        auVar76 = vfmadd213ps_avx512vl(auVar88,auVar43,local_440);
        auVar74 = vsubps_avx(auVar74,auVar76);
        auVar66 = vfmadd213ps_fma(auVar89,auVar43,local_620);
        auVar75 = vsubps_avx512vl(auVar75,ZEXT1632(auVar66));
        auVar219 = ZEXT3264(auVar75);
        auVar178._8_4_ = 0x7f800000;
        auVar178._0_8_ = 0x7f8000007f800000;
        auVar178._12_4_ = 0x7f800000;
        auVar178._16_4_ = 0x7f800000;
        auVar178._20_4_ = 0x7f800000;
        auVar178._24_4_ = 0x7f800000;
        auVar178._28_4_ = 0x7f800000;
        auVar75 = vblendmps_avx512vl(auVar178,auVar83);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar89._0_4_ = (uint)bVar58 * auVar75._0_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar89._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar89._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar89._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar89._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar89._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar89._24_4_ = (uint)bVar58 * auVar75._24_4_ | (uint)!bVar58 * 0x7f800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar89._28_4_ = (uint)bVar58 * auVar75._28_4_ | (uint)!bVar58 * 0x7f800000;
        auVar203._8_4_ = 0xff800000;
        auVar203._0_8_ = 0xff800000ff800000;
        auVar203._12_4_ = 0xff800000;
        auVar203._16_4_ = 0xff800000;
        auVar203._20_4_ = 0xff800000;
        auVar203._24_4_ = 0xff800000;
        auVar203._28_4_ = 0xff800000;
        auVar75 = vblendmps_avx512vl(auVar203,auVar82);
        bVar58 = (bool)((byte)uVar60 & 1);
        auVar93._0_4_ = (uint)bVar58 * auVar75._0_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
        auVar93._4_4_ = (uint)bVar58 * auVar75._4_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
        auVar93._8_4_ = (uint)bVar58 * auVar75._8_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
        auVar93._12_4_ = (uint)bVar58 * auVar75._12_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
        auVar93._16_4_ = (uint)bVar58 * auVar75._16_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
        auVar93._20_4_ = (uint)bVar58 * auVar75._20_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
        auVar93._24_4_ = (uint)bVar58 * auVar75._24_4_ | (uint)!bVar58 * -0x800000;
        bVar58 = SUB81(uVar60 >> 7,0);
        auVar93._28_4_ = (uint)bVar58 * auVar75._28_4_ | (uint)!bVar58 * -0x800000;
        auVar94._8_4_ = 0x36000000;
        auVar94._0_8_ = 0x3600000036000000;
        auVar94._12_4_ = 0x36000000;
        auVar94._16_4_ = 0x36000000;
        auVar94._20_4_ = 0x36000000;
        auVar94._24_4_ = 0x36000000;
        auVar94._28_4_ = 0x36000000;
        auVar75 = vmulps_avx512vl(auVar77,auVar94);
        uVar17 = vcmpps_avx512vl(auVar75,local_400,0xe);
        uVar60 = uVar60 & uVar17;
        bVar53 = (byte)uVar60;
        if (bVar53 != 0) {
          uVar17 = vcmpps_avx512vl(auVar79,ZEXT1632(auVar64),2);
          auVar223._8_4_ = 0x7f800000;
          auVar223._0_8_ = 0x7f8000007f800000;
          auVar223._12_4_ = 0x7f800000;
          auVar223._16_4_ = 0x7f800000;
          auVar223._20_4_ = 0x7f800000;
          auVar223._24_4_ = 0x7f800000;
          auVar223._28_4_ = 0x7f800000;
          auVar231._8_4_ = 0xff800000;
          auVar231._0_8_ = 0xff800000ff800000;
          auVar231._12_4_ = 0xff800000;
          auVar231._16_4_ = 0xff800000;
          auVar231._20_4_ = 0xff800000;
          auVar231._24_4_ = 0xff800000;
          auVar231._28_4_ = 0xff800000;
          auVar76 = vblendmps_avx512vl(auVar223,auVar231);
          bVar52 = (byte)uVar17;
          uVar61 = (uint)(bVar52 & 1) * auVar76._0_4_ | (uint)!(bool)(bVar52 & 1) * auVar75._0_4_;
          bVar58 = (bool)((byte)(uVar17 >> 1) & 1);
          uVar110 = (uint)bVar58 * auVar76._4_4_ | (uint)!bVar58 * auVar75._4_4_;
          bVar58 = (bool)((byte)(uVar17 >> 2) & 1);
          uVar111 = (uint)bVar58 * auVar76._8_4_ | (uint)!bVar58 * auVar75._8_4_;
          bVar58 = (bool)((byte)(uVar17 >> 3) & 1);
          uVar112 = (uint)bVar58 * auVar76._12_4_ | (uint)!bVar58 * auVar75._12_4_;
          bVar58 = (bool)((byte)(uVar17 >> 4) & 1);
          uVar113 = (uint)bVar58 * auVar76._16_4_ | (uint)!bVar58 * auVar75._16_4_;
          bVar58 = (bool)((byte)(uVar17 >> 5) & 1);
          uVar114 = (uint)bVar58 * auVar76._20_4_ | (uint)!bVar58 * auVar75._20_4_;
          bVar58 = (bool)((byte)(uVar17 >> 6) & 1);
          uVar115 = (uint)bVar58 * auVar76._24_4_ | (uint)!bVar58 * auVar75._24_4_;
          bVar58 = SUB81(uVar17 >> 7,0);
          uVar116 = (uint)bVar58 * auVar76._28_4_ | (uint)!bVar58 * auVar75._28_4_;
          auVar89._0_4_ = (bVar53 & 1) * uVar61 | !(bool)(bVar53 & 1) * auVar89._0_4_;
          bVar58 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar89._4_4_ = bVar58 * uVar110 | !bVar58 * auVar89._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar89._8_4_ = bVar58 * uVar111 | !bVar58 * auVar89._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar89._12_4_ = bVar58 * uVar112 | !bVar58 * auVar89._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar89._16_4_ = bVar58 * uVar113 | !bVar58 * auVar89._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar89._20_4_ = bVar58 * uVar114 | !bVar58 * auVar89._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar89._24_4_ = bVar58 * uVar115 | !bVar58 * auVar89._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar89._28_4_ = bVar58 * uVar116 | !bVar58 * auVar89._28_4_;
          auVar75 = vblendmps_avx512vl(auVar231,auVar223);
          bVar58 = (bool)((byte)(uVar17 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar17 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar17 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar17 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar17 >> 6) & 1);
          bVar12 = SUB81(uVar17 >> 7,0);
          auVar93._0_4_ =
               (uint)(bVar53 & 1) *
               ((uint)(bVar52 & 1) * auVar75._0_4_ | !(bool)(bVar52 & 1) * uVar61) |
               !(bool)(bVar53 & 1) * auVar93._0_4_;
          bVar6 = (bool)((byte)(uVar60 >> 1) & 1);
          auVar93._4_4_ =
               (uint)bVar6 * ((uint)bVar58 * auVar75._4_4_ | !bVar58 * uVar110) |
               !bVar6 * auVar93._4_4_;
          bVar58 = (bool)((byte)(uVar60 >> 2) & 1);
          auVar93._8_4_ =
               (uint)bVar58 * ((uint)bVar7 * auVar75._8_4_ | !bVar7 * uVar111) |
               !bVar58 * auVar93._8_4_;
          bVar58 = (bool)((byte)(uVar60 >> 3) & 1);
          auVar93._12_4_ =
               (uint)bVar58 * ((uint)bVar8 * auVar75._12_4_ | !bVar8 * uVar112) |
               !bVar58 * auVar93._12_4_;
          bVar58 = (bool)((byte)(uVar60 >> 4) & 1);
          auVar93._16_4_ =
               (uint)bVar58 * ((uint)bVar9 * auVar75._16_4_ | !bVar9 * uVar113) |
               !bVar58 * auVar93._16_4_;
          bVar58 = (bool)((byte)(uVar60 >> 5) & 1);
          auVar93._20_4_ =
               (uint)bVar58 * ((uint)bVar10 * auVar75._20_4_ | !bVar10 * uVar114) |
               !bVar58 * auVar93._20_4_;
          bVar58 = (bool)((byte)(uVar60 >> 6) & 1);
          auVar93._24_4_ =
               (uint)bVar58 * ((uint)bVar11 * auVar75._24_4_ | !bVar11 * uVar115) |
               !bVar58 * auVar93._24_4_;
          bVar58 = SUB81(uVar60 >> 7,0);
          auVar93._28_4_ =
               (uint)bVar58 * ((uint)bVar12 * auVar75._28_4_ | !bVar12 * uVar116) |
               !bVar58 * auVar93._28_4_;
          uVar55 = (ulong)(byte)((~bVar53 | bVar52) & (byte)uVar55);
        }
      }
      auVar246 = ZEXT3264(local_7a0);
      auVar244 = ZEXT3264(local_7c0);
      auVar235 = ZEXT3264(local_7e0);
      auVar237 = ZEXT3264(local_800);
      auVar238 = ZEXT3264(local_820);
      auVar241 = ZEXT3264(local_840);
      auVar242 = ZEXT3264(local_860);
      auVar243 = ZEXT3264(local_880);
      uVar117 = *(undefined4 *)&(ray->dir).field_0;
      auVar218._4_4_ = uVar117;
      auVar218._0_4_ = uVar117;
      auVar218._8_4_ = uVar117;
      auVar218._12_4_ = uVar117;
      auVar218._16_4_ = uVar117;
      auVar218._20_4_ = uVar117;
      auVar218._24_4_ = uVar117;
      auVar218._28_4_ = uVar117;
      uVar117 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar224._4_4_ = uVar117;
      auVar224._0_4_ = uVar117;
      auVar224._8_4_ = uVar117;
      auVar224._12_4_ = uVar117;
      auVar224._16_4_ = uVar117;
      auVar224._20_4_ = uVar117;
      auVar224._24_4_ = uVar117;
      auVar224._28_4_ = uVar117;
      fVar134 = (ray->dir).field_0.m128[2];
      auVar228._0_4_ = fVar134 * auVar219._0_4_;
      auVar228._4_4_ = fVar134 * auVar219._4_4_;
      auVar228._8_4_ = fVar134 * auVar219._8_4_;
      auVar228._12_4_ = fVar134 * auVar219._12_4_;
      auVar228._16_4_ = fVar134 * auVar219._16_4_;
      auVar228._20_4_ = fVar134 * auVar219._20_4_;
      auVar228._28_36_ = auVar219._28_36_;
      auVar228._24_4_ = fVar134 * auVar219._24_4_;
      auVar66 = vfmadd231ps_fma(auVar228._0_32_,auVar224,auVar74);
      auVar66 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar218,auVar80);
      auVar229._8_4_ = 0x7fffffff;
      auVar229._0_8_ = 0x7fffffff7fffffff;
      auVar229._12_4_ = 0x7fffffff;
      auVar229._16_4_ = 0x7fffffff;
      auVar229._20_4_ = 0x7fffffff;
      auVar229._24_4_ = 0x7fffffff;
      auVar229._28_4_ = 0x7fffffff;
      auVar74 = vandps_avx(auVar229,ZEXT1632(auVar66));
      _local_2a0 = _local_6a0;
      auVar211._8_4_ = 0x3e99999a;
      auVar211._0_8_ = 0x3e99999a3e99999a;
      auVar211._12_4_ = 0x3e99999a;
      auVar211._16_4_ = 0x3e99999a;
      auVar211._20_4_ = 0x3e99999a;
      auVar211._24_4_ = 0x3e99999a;
      auVar211._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar74,auVar211,1);
      local_380._0_2_ = (short)uVar15;
      local_2e0 = vmaxps_avx512vl(_local_6a0,auVar93);
      auVar74 = vminps_avx(local_2c0,auVar89);
      uVar15 = vcmpps_avx512vl(_local_6a0,auVar74,2);
      bVar53 = (byte)uVar15 & bVar50;
      uVar16 = vcmpps_avx512vl(local_2e0,local_2c0,2);
      auVar239 = ZEXT3264(local_640);
      auVar240 = ZEXT3264(local_660);
      if ((bVar50 & ((byte)uVar16 | (byte)uVar15)) == 0) {
        auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar226 = ZEXT3264(local_720);
        auVar228 = ZEXT3264(local_740);
        auVar230 = ZEXT3264(local_760);
        auVar232 = ZEXT3264(local_900);
      }
      else {
        auVar45._4_4_ = auVar227._4_4_ * fVar134;
        auVar45._0_4_ = auVar227._0_4_ * fVar134;
        auVar45._8_4_ = auVar227._8_4_ * fVar134;
        auVar45._12_4_ = auVar227._12_4_ * fVar134;
        auVar45._16_4_ = auVar227._16_4_ * fVar134;
        auVar45._20_4_ = auVar227._20_4_ * fVar134;
        auVar45._24_4_ = auVar227._24_4_ * fVar134;
        auVar45._28_4_ = auVar74._28_4_;
        auVar66 = vfmadd213ps_fma(auVar81,auVar224,auVar45);
        auVar66 = vfmadd213ps_fma(auVar78,auVar218,ZEXT1632(auVar66));
        auVar74 = vandps_avx(auVar229,ZEXT1632(auVar66));
        uVar15 = vcmpps_avx512vl(auVar74,auVar211,1);
        local_888 = (int)CONCAT71((int7)(uVar55 >> 8),~(byte)uVar55);
        bVar52 = (byte)uVar15 | ~(byte)uVar55;
        auVar128._8_4_ = 2;
        auVar128._0_8_ = 0x200000002;
        auVar128._12_4_ = 2;
        auVar128._16_4_ = 2;
        auVar128._20_4_ = 2;
        auVar128._24_4_ = 2;
        auVar128._28_4_ = 2;
        auVar32._8_4_ = 3;
        auVar32._0_8_ = 0x300000003;
        auVar32._12_4_ = 3;
        auVar32._16_4_ = 3;
        auVar32._20_4_ = 3;
        auVar32._24_4_ = 3;
        auVar32._28_4_ = 3;
        auVar74 = vpblendmd_avx512vl(auVar128,auVar32);
        local_240._0_4_ = (uint)(bVar52 & 1) * auVar74._0_4_ | (uint)!(bool)(bVar52 & 1) * 2;
        bVar58 = (bool)(bVar52 >> 1 & 1);
        local_240._4_4_ = (uint)bVar58 * auVar74._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 2 & 1);
        local_240._8_4_ = (uint)bVar58 * auVar74._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 3 & 1);
        local_240._12_4_ = (uint)bVar58 * auVar74._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 4 & 1);
        local_240._16_4_ = (uint)bVar58 * auVar74._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 5 & 1);
        local_240._20_4_ = (uint)bVar58 * auVar74._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar52 >> 6 & 1);
        local_240._24_4_ = (uint)bVar58 * auVar74._24_4_ | (uint)!bVar58 * 2;
        local_240._28_4_ = (uint)(bVar52 >> 7) * auVar74._28_4_ | (uint)!(bool)(bVar52 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_320,local_240,5);
        local_884 = (uint)bVar53;
        bVar53 = (byte)uVar15 & bVar53;
        auVar226 = ZEXT3264(local_720);
        _local_3c0 = auVar130;
        if (bVar53 == 0) {
          fVar134 = ray->tfar;
          auVar130._4_4_ = fVar134;
          auVar130._0_4_ = fVar134;
          auVar130._8_4_ = fVar134;
          auVar130._12_4_ = fVar134;
          auVar130._16_4_ = fVar134;
          auVar130._20_4_ = fVar134;
          auVar130._24_4_ = fVar134;
          auVar130._28_4_ = fVar134;
          auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar228 = ZEXT3264(local_740);
          auVar230 = ZEXT3264(local_760);
          auVar232 = ZEXT3264(local_900);
          auVar73 = local_2e0;
        }
        else {
          local_260 = local_2e0;
          auVar64 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar66 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar69 = vminps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar70 = vminps_avx(auVar64,auVar69);
          auVar64 = vmaxps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar69 = vmaxps_avx(auVar66,auVar64);
          auVar162._8_4_ = 0x7fffffff;
          auVar162._0_8_ = 0x7fffffff7fffffff;
          auVar162._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar70,auVar162);
          auVar64 = vandps_avx(auVar69,auVar162);
          auVar66 = vmaxps_avx(auVar66,auVar64);
          auVar64 = vmovshdup_avx(auVar66);
          auVar64 = vmaxss_avx(auVar64,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar64);
          fVar134 = auVar66._0_4_ * 1.9073486e-06;
          local_510 = vshufps_avx(auVar69,auVar69,0xff);
          local_360 = (float)local_940._0_4_ + (float)local_6a0._0_4_;
          fStack_35c = (float)local_940._4_4_ + (float)local_6a0._4_4_;
          fStack_358 = fStack_938 + fStack_698;
          fStack_354 = fStack_934 + fStack_694;
          fStack_350 = fStack_930 + fStack_690;
          fStack_34c = fStack_92c + fStack_68c;
          fStack_348 = fStack_928 + fStack_688;
          fStack_344 = fStack_924 + fStack_684;
          _local_6a0 = auVar73;
          do {
            auVar75 = _local_8e0;
            auVar129._8_4_ = 0x7f800000;
            auVar129._0_8_ = 0x7f8000007f800000;
            auVar129._12_4_ = 0x7f800000;
            auVar129._16_4_ = 0x7f800000;
            auVar129._20_4_ = 0x7f800000;
            auVar129._24_4_ = 0x7f800000;
            auVar129._28_4_ = 0x7f800000;
            auVar73 = vblendmps_avx512vl(auVar129,_local_6a0);
            auVar107._0_4_ =
                 (uint)(bVar53 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 1 & 1);
            auVar107._4_4_ = (uint)bVar58 * auVar73._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 2 & 1);
            auVar107._8_4_ = (uint)bVar58 * auVar73._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 3 & 1);
            auVar107._12_4_ = (uint)bVar58 * auVar73._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 4 & 1);
            auVar107._16_4_ = (uint)bVar58 * auVar73._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 5 & 1);
            auVar107._20_4_ = (uint)bVar58 * auVar73._20_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 6 & 1);
            auVar107._24_4_ = (uint)bVar58 * auVar73._24_4_ | (uint)!bVar58 * 0x7f800000;
            auVar107._28_4_ =
                 (uint)(bVar53 >> 7) * auVar73._28_4_ | (uint)!(bool)(bVar53 >> 7) * 0x7f800000;
            auVar73 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar73 = vminps_avx(auVar107,auVar73);
            auVar74 = vshufpd_avx(auVar73,auVar73,5);
            auVar73 = vminps_avx(auVar73,auVar74);
            auVar74 = vpermpd_avx2(auVar73,0x4e);
            auVar73 = vminps_avx(auVar73,auVar74);
            uVar15 = vcmpps_avx512vl(auVar107,auVar73,0);
            bVar51 = (byte)uVar15 & bVar53;
            bVar52 = bVar53;
            if (bVar51 != 0) {
              bVar52 = bVar51;
            }
            iVar19 = 0;
            for (uVar61 = (uint)bVar52; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_5e0._0_16_ = (undefined1  [16])aVar1;
            auVar66 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar66._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar53;
              stack0xfffffffffffff722 = auVar75._2_30_;
              _local_700 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
              local_620._0_16_ = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar19 << 2)));
              fVar149 = sqrtf(auVar66._0_4_);
              bVar53 = local_8e0[0];
              auVar66 = local_620._0_16_;
              auVar64 = _local_700;
            }
            else {
              auVar66 = vsqrtss_avx(auVar66,auVar66);
              fVar149 = auVar66._0_4_;
              auVar66 = ZEXT416(*(uint *)(local_2a0 + (uint)(iVar19 << 2)));
              auVar64 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
            }
            auVar66 = vinsertps_avx512f(auVar66,auVar64,0x10);
            bVar58 = true;
            uVar55 = 0;
            do {
              auVar64 = vbroadcastss_avx512vl(auVar66);
              auVar69 = vfmadd132ps_fma(auVar64,ZEXT816(0) << 0x40,local_5e0._0_16_);
              auVar64 = vmovshdup_avx512vl(auVar66);
              local_3e0._0_16_ = auVar64;
              fVar132 = 1.0 - auVar64._0_4_;
              auVar64 = vshufps_avx512vl(auVar66,auVar66,0x55);
              fVar133 = auVar64._0_4_;
              auVar163._0_4_ = local_4a0._0_4_ * fVar133;
              fVar148 = auVar64._4_4_;
              auVar163._4_4_ = local_4a0._4_4_ * fVar148;
              fVar150 = auVar64._8_4_;
              auVar163._8_4_ = local_4a0._8_4_ * fVar150;
              fVar152 = auVar64._12_4_;
              auVar163._12_4_ = local_4a0._12_4_ * fVar152;
              _local_3c0 = ZEXT416((uint)fVar132);
              auVar183._4_4_ = fVar132;
              auVar183._0_4_ = fVar132;
              auVar183._8_4_ = fVar132;
              auVar183._12_4_ = fVar132;
              auVar64 = vfmadd231ps_fma(auVar163,auVar183,local_460._0_16_);
              auVar199._0_4_ = local_480._0_4_ * fVar133;
              auVar199._4_4_ = local_480._4_4_ * fVar148;
              auVar199._8_4_ = local_480._8_4_ * fVar150;
              auVar199._12_4_ = local_480._12_4_ * fVar152;
              auVar70 = vfmadd231ps_fma(auVar199,auVar183,local_4a0._0_16_);
              auVar207._0_4_ = fVar133 * (float)local_4c0._0_4_;
              auVar207._4_4_ = fVar148 * (float)local_4c0._4_4_;
              auVar207._8_4_ = fVar150 * fStack_4b8;
              auVar207._12_4_ = fVar152 * fStack_4b4;
              auVar67 = vfmadd231ps_fma(auVar207,auVar183,local_480._0_16_);
              auVar216._0_4_ = fVar133 * auVar70._0_4_;
              auVar216._4_4_ = fVar148 * auVar70._4_4_;
              auVar216._8_4_ = fVar150 * auVar70._8_4_;
              auVar216._12_4_ = fVar152 * auVar70._12_4_;
              auVar64 = vfmadd231ps_fma(auVar216,auVar183,auVar64);
              auVar164._0_4_ = fVar133 * auVar67._0_4_;
              auVar164._4_4_ = fVar148 * auVar67._4_4_;
              auVar164._8_4_ = fVar150 * auVar67._8_4_;
              auVar164._12_4_ = fVar152 * auVar67._12_4_;
              auVar70 = vfmadd231ps_fma(auVar164,auVar183,auVar70);
              auVar200._0_4_ = fVar133 * auVar70._0_4_;
              auVar200._4_4_ = fVar148 * auVar70._4_4_;
              auVar200._8_4_ = fVar150 * auVar70._8_4_;
              auVar200._12_4_ = fVar152 * auVar70._12_4_;
              auVar67 = vfmadd231ps_fma(auVar200,auVar64,auVar183);
              auVar64 = vsubps_avx(auVar70,auVar64);
              auVar22._8_4_ = 0x40400000;
              auVar22._0_8_ = 0x4040000040400000;
              auVar22._12_4_ = 0x40400000;
              auVar64 = vmulps_avx512vl(auVar64,auVar22);
              _local_8e0 = auVar64;
              local_3a0._0_16_ = auVar67;
              auVar64 = vsubps_avx(auVar69,auVar67);
              _local_700 = auVar64;
              auVar64 = vdpps_avx(auVar64,auVar64,0x7f);
              local_620._0_16_ = auVar64;
              local_540._0_16_ = auVar66;
              if (auVar64._0_4_ < 0.0) {
                auVar230._0_4_ = sqrtf(auVar64._0_4_);
                auVar230._4_60_ = extraout_var;
                auVar66 = auVar230._0_16_;
              }
              else {
                auVar66 = vsqrtss_avx(auVar64,auVar64);
              }
              local_400._0_16_ = vdpps_avx(_local_8e0,_local_8e0,0x7f);
              fVar148 = local_400._0_4_;
              auVar165._4_12_ = ZEXT812(0) << 0x20;
              auVar165._0_4_ = fVar148;
              local_580._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
              fVar133 = local_580._0_4_ * 1.5;
              local_420._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_400._0_16_,auVar23);
              auVar64 = vfnmadd213ss_fma(local_420._0_16_,local_400._0_16_,ZEXT416(0x40000000));
              local_440._0_4_ = auVar64._0_4_;
              local_560._0_4_ = auVar66._0_4_;
              if (fVar148 < auVar69._0_4_) {
                local_8a0._0_4_ = fVar133;
                local_8b0._0_4_ = fVar148 * -0.5;
                fVar150 = sqrtf(fVar148);
                auVar66 = ZEXT416((uint)local_560._0_4_);
                fVar133 = (float)local_8b0._0_4_;
              }
              else {
                auVar64 = vsqrtss_avx(local_400._0_16_,local_400._0_16_);
                fVar150 = auVar64._0_4_;
                local_8a0._0_4_ = fVar133;
                fVar133 = fVar148 * -0.5;
              }
              fVar148 = local_580._0_4_;
              fVar133 = (float)local_8a0._0_4_ + fVar133 * fVar148 * fVar148 * fVar148;
              local_8a0._0_4_ = fVar133 * (float)local_8e0._0_4_;
              local_8a0._4_4_ = fVar133 * (float)local_8e0._4_4_;
              local_8a0._8_4_ = fVar133 * fStack_8d8;
              local_8a0._12_4_ = fVar133 * fStack_8d4;
              local_580._0_16_ = vdpps_avx(local_8a0,_local_700,0x7f);
              auVar70 = vaddss_avx512f(auVar66,ZEXT416(0x3f800000));
              auVar122._0_4_ = local_580._0_4_ * local_580._0_4_;
              auVar122._4_4_ = local_580._4_4_ * local_580._4_4_;
              auVar122._8_4_ = local_580._8_4_ * local_580._8_4_;
              auVar122._12_4_ = local_580._12_4_ * local_580._12_4_;
              auVar64 = vsubps_avx(local_620._0_16_,auVar122);
              fVar148 = auVar64._0_4_;
              auVar137._4_12_ = ZEXT812(0) << 0x20;
              auVar137._0_4_ = fVar148;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar137);
              auVar67 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              in_ZMM31 = ZEXT1664(auVar67);
              local_8b0._0_4_ = fVar148 * -0.5;
              uVar59 = fVar148 == 0.0;
              uVar57 = fVar148 < 0.0;
              if ((bool)uVar57) {
                local_4f0._0_4_ = auVar67._0_4_;
                local_500 = fVar133;
                fStack_4fc = fVar133;
                fStack_4f8 = fVar133;
                fStack_4f4 = fVar133;
                local_4e0 = auVar69;
                fVar151 = sqrtf(fVar148);
                in_ZMM31 = ZEXT464((uint)local_4f0._0_4_);
                auVar66 = ZEXT416((uint)local_560._0_4_);
                auVar70 = ZEXT416(auVar70._0_4_);
                auVar69 = local_4e0;
                fVar133 = local_500;
                fVar148 = fStack_4fc;
                fVar152 = fStack_4f8;
                fVar132 = fStack_4f4;
              }
              else {
                auVar64 = vsqrtss_avx(auVar64,auVar64);
                fVar151 = auVar64._0_4_;
                fVar148 = fVar133;
                fVar152 = fVar133;
                fVar132 = fVar133;
              }
              auVar238 = ZEXT3264(local_820);
              auVar241 = ZEXT3264(local_840);
              auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_3c0,local_3e0._0_16_);
              auVar64 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3e0._0_16_,_local_3c0);
              fVar154 = auVar64._0_4_ * 6.0;
              fVar156 = local_3e0._0_4_ * 6.0;
              auVar184._0_4_ = fVar156 * (float)local_4c0._0_4_;
              auVar184._4_4_ = fVar156 * (float)local_4c0._4_4_;
              auVar184._8_4_ = fVar156 * fStack_4b8;
              auVar184._12_4_ = fVar156 * fStack_4b4;
              auVar166._4_4_ = fVar154;
              auVar166._0_4_ = fVar154;
              auVar166._8_4_ = fVar154;
              auVar166._12_4_ = fVar154;
              auVar64 = vfmadd132ps_fma(auVar166,auVar184,local_480._0_16_);
              fVar154 = auVar67._0_4_ * 6.0;
              auVar138._4_4_ = fVar154;
              auVar138._0_4_ = fVar154;
              auVar138._8_4_ = fVar154;
              auVar138._12_4_ = fVar154;
              auVar64 = vfmadd132ps_fma(auVar138,auVar64,local_4a0._0_16_);
              fVar154 = local_3c0._0_4_ * 6.0;
              auVar167._4_4_ = fVar154;
              auVar167._0_4_ = fVar154;
              auVar167._8_4_ = fVar154;
              auVar167._12_4_ = fVar154;
              auVar64 = vfmadd132ps_fma(auVar167,auVar64,local_460._0_16_);
              auVar139._0_4_ = auVar64._0_4_ * (float)local_400._0_4_;
              auVar139._4_4_ = auVar64._4_4_ * (float)local_400._0_4_;
              auVar139._8_4_ = auVar64._8_4_ * (float)local_400._0_4_;
              auVar139._12_4_ = auVar64._12_4_ * (float)local_400._0_4_;
              auVar64 = vdpps_avx(_local_8e0,auVar64,0x7f);
              fVar154 = auVar64._0_4_;
              auVar168._0_4_ = local_8e0._0_4_ * fVar154;
              auVar168._4_4_ = local_8e0._4_4_ * fVar154;
              auVar168._8_4_ = local_8e0._8_4_ * fVar154;
              auVar168._12_4_ = local_8e0._12_4_ * fVar154;
              auVar64 = vsubps_avx(auVar139,auVar168);
              fVar154 = (float)local_440._0_4_ * (float)local_420._0_4_;
              auVar67 = vmulss_avx512f(local_540._0_16_,ZEXT416((uint)(fVar149 * 1.9073486e-06)));
              auVar67 = vmaxss_avx(ZEXT416((uint)fVar134),auVar67);
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(_local_8e0,auVar24);
              auVar169._0_4_ = fVar133 * auVar64._0_4_ * fVar154;
              auVar169._4_4_ = fVar148 * auVar64._4_4_ * fVar154;
              auVar169._8_4_ = fVar152 * auVar64._8_4_ * fVar154;
              auVar169._12_4_ = fVar132 * auVar64._12_4_ * fVar154;
              auVar64 = vdpps_avx(auVar68,local_8a0,0x7f);
              auVar71 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar134),auVar67);
              auVar66 = vdpps_avx(_local_700,auVar169,0x7f);
              vfmadd213ss_avx512f(auVar70,ZEXT416((uint)(fVar134 / fVar150)),auVar71);
              fVar133 = auVar64._0_4_ + auVar66._0_4_;
              auVar66 = vdpps_avx(local_5e0._0_16_,local_8a0,0x7f);
              auVar64 = vdpps_avx(_local_700,auVar68,0x7f);
              auVar70 = vmulss_avx512f(auVar69,ZEXT416((uint)local_8b0._0_4_));
              auVar69 = vmulss_avx512f(auVar69,auVar69);
              auVar68 = vaddss_avx512f(in_ZMM31._0_16_,
                                       ZEXT416((uint)(auVar70._0_4_ * auVar69._0_4_)));
              auVar69 = vdpps_avx(_local_700,local_5e0._0_16_,0x7f);
              auVar71 = vfnmadd231ss_fma(auVar64,local_580._0_16_,ZEXT416((uint)fVar133));
              auVar69 = vfnmadd231ss_fma(auVar69,local_580._0_16_,auVar66);
              auVar64 = vpermilps_avx(local_3a0._0_16_,0xff);
              fVar151 = fVar151 - auVar64._0_4_;
              auVar70 = vshufps_avx(_local_8e0,_local_8e0,0xff);
              auVar64 = vfmsub213ss_fma(auVar71,auVar68,auVar70);
              auVar221._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
              auVar221._8_4_ = auVar64._8_4_ ^ 0x80000000;
              auVar221._12_4_ = auVar64._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar68._0_4_));
              auVar71 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar64._0_4_)),
                                        ZEXT416((uint)fVar133),auVar69);
              auVar64 = vinsertps_avx(auVar221,auVar69,0x1c);
              auVar208._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
              auVar208._8_4_ = auVar66._8_4_ ^ 0x80000000;
              auVar208._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar133),auVar208,0x10);
              auVar185._0_4_ = auVar71._0_4_;
              auVar185._4_4_ = auVar185._0_4_;
              auVar185._8_4_ = auVar185._0_4_;
              auVar185._12_4_ = auVar185._0_4_;
              auVar66 = vdivps_avx(auVar64,auVar185);
              auVar64 = vdivps_avx(auVar69,auVar185);
              fVar133 = local_580._0_4_;
              auVar186._0_4_ = fVar133 * auVar66._0_4_ + fVar151 * auVar64._0_4_;
              auVar186._4_4_ = fVar133 * auVar66._4_4_ + fVar151 * auVar64._4_4_;
              auVar186._8_4_ = fVar133 * auVar66._8_4_ + fVar151 * auVar64._8_4_;
              auVar186._12_4_ = fVar133 * auVar66._12_4_ + fVar151 * auVar64._12_4_;
              auVar66 = vsubps_avx512vl(local_540._0_16_,auVar186);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar64 = vandps_avx512vl(local_580._0_16_,auVar25);
              auVar64 = vucomiss_avx512f(auVar64);
              fVar133 = (float)local_940._0_4_;
              fVar148 = (float)local_940._4_4_;
              fVar150 = fStack_938;
              fVar152 = fStack_934;
              fVar132 = fStack_930;
              fVar154 = fStack_92c;
              fVar156 = fStack_928;
              fVar158 = fStack_924;
              if (!(bool)uVar57 && !(bool)uVar59) {
                auVar64 = vaddss_avx512f(auVar67,auVar64);
                auVar64 = vfmadd231ss_fma(auVar64,local_510,ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar151),auVar26);
                if (auVar69._0_4_ < auVar64._0_4_) {
                  auVar64 = vaddss_avx512f(auVar66,ZEXT416((uint)local_520._0_4_));
                  bVar52 = 0;
                  fVar149 = auVar64._0_4_;
                  auVar226 = ZEXT3264(local_720);
                  bVar51 = 0;
                  if (fVar149 < (ray->org).field_0.m128[3]) goto LAB_01af0a55;
                  auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (ray->tfar < fVar149) goto LAB_01af0a70;
                  auVar66 = vmovshdup_avx512vl(auVar66);
                  bVar52 = 0;
                  fVar151 = auVar66._0_4_;
                  if ((fVar151 < 0.0) || (bVar52 = 0, 1.0 < fVar151)) goto LAB_01af0a70;
                  auVar46._12_4_ = 0;
                  auVar46._0_12_ = ZEXT812(0);
                  auVar66 = vrsqrt14ss_avx512f(auVar46 << 0x20,ZEXT416((uint)local_620._0_4_));
                  fVar153 = auVar66._0_4_;
                  pGVar4 = (context->scene->geometries).items[local_908].ptr;
                  if ((pGVar4->mask & ray->mask) == 0) {
                    bVar52 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar52 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_5e0._0_4_ = ray->tfar;
                    fVar133 = fVar153 * 1.5 +
                              (float)local_620._0_4_ * -0.5 * fVar153 * fVar153 * fVar153;
                    auVar187._0_4_ = fVar133 * (float)local_700._0_4_;
                    auVar187._4_4_ = fVar133 * (float)local_700._4_4_;
                    auVar187._8_4_ = fVar133 * fStack_6f8;
                    auVar187._12_4_ = fVar133 * fStack_6f4;
                    auVar70 = vfmadd213ps_fma(auVar70,auVar187,_local_8e0);
                    auVar66 = vshufps_avx(auVar187,auVar187,0xc9);
                    auVar64 = vshufps_avx(_local_8e0,_local_8e0,0xc9);
                    auVar188._0_4_ = auVar187._0_4_ * auVar64._0_4_;
                    auVar188._4_4_ = auVar187._4_4_ * auVar64._4_4_;
                    auVar188._8_4_ = auVar187._8_4_ * auVar64._8_4_;
                    auVar188._12_4_ = auVar187._12_4_ * auVar64._12_4_;
                    auVar69 = vfmsub231ps_fma(auVar188,_local_8e0,auVar66);
                    auVar66 = vshufps_avx(auVar69,auVar69,0xc9);
                    auVar64 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                    auVar123._0_4_ = auVar70._0_4_ * auVar69._0_4_;
                    auVar123._4_4_ = auVar70._4_4_ * auVar69._4_4_;
                    auVar123._8_4_ = auVar70._8_4_ * auVar69._8_4_;
                    auVar123._12_4_ = auVar70._12_4_ * auVar69._12_4_;
                    auVar64 = vfmsub231ps_fma(auVar123,auVar66,auVar64);
                    auVar66 = vshufps_avx(auVar64,auVar64,0xe9);
                    local_5c0 = vmovlps_avx(auVar66);
                    local_5b8 = auVar64._0_4_;
                    local_5b4 = fVar151;
                    local_5b0 = 0;
                    local_5ac = (int)local_588;
                    local_5a8 = (int)local_908;
                    local_5a4 = context->user->instID[0];
                    local_5a0 = context->user->instPrimID[0];
                    ray->tfar = fVar149;
                    local_944 = -1;
                    local_6d0.valid = &local_944;
                    local_6d0.geometryUserPtr = pGVar4->userPtr;
                    local_6d0.context = context->user;
                    local_6d0.ray = (RTCRayN *)ray;
                    local_6d0.hit = (RTCHitN *)&local_5c0;
                    local_6d0.N = 1;
                    if ((pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->occlusionFilterN)(&local_6d0), *local_6d0.valid != 0)) {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                            RTC_RAY_QUERY_FLAG_INCOHERENT ||
                           (((pGVar4->field_8).field_0x2 & 0x40) != 0)) &&
                          ((*p_Var5)(&local_6d0), *local_6d0.valid == 0)))) goto LAB_01af0db2;
                      bVar52 = 1;
                    }
                    else {
LAB_01af0db2:
                      ray->tfar = (float)local_5e0._0_4_;
                      bVar52 = 0;
                    }
                    auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    auVar226 = ZEXT3264(local_720);
                    auVar228 = ZEXT3264(local_740);
                    auVar230 = ZEXT3264(local_760);
                    auVar232 = ZEXT3264(local_900);
                    auVar246 = ZEXT3264(local_7a0);
                    auVar244 = ZEXT3264(local_7c0);
                    auVar235 = ZEXT3264(local_7e0);
                    auVar237 = ZEXT3264(local_800);
                    auVar238 = ZEXT3264(local_820);
                    auVar239 = ZEXT3264(local_640);
                    auVar240 = ZEXT3264(local_660);
                    auVar241 = ZEXT3264(local_840);
                    auVar242 = ZEXT3264(local_860);
                    auVar243 = ZEXT3264(local_880);
                    auVar245 = ZEXT3264(local_680);
                    fVar133 = (float)local_940._0_4_;
                    fVar148 = (float)local_940._4_4_;
                    fVar150 = fStack_938;
                    fVar152 = fStack_934;
                    fVar132 = fStack_930;
                    fVar154 = fStack_92c;
                    fVar156 = fStack_928;
                    fVar158 = fStack_924;
                    goto LAB_01af0ab8;
                  }
                  auVar245 = ZEXT3264(local_680);
                  auVar246 = ZEXT3264(local_7a0);
                  auVar244 = ZEXT3264(local_7c0);
                  auVar235 = ZEXT3264(local_7e0);
                  auVar237 = ZEXT3264(local_800);
                  auVar242 = ZEXT3264(local_860);
                  auVar243 = ZEXT3264(local_880);
                  auVar239 = ZEXT3264(local_640);
                  auVar240 = ZEXT3264(local_660);
                  auVar228 = ZEXT3264(local_740);
                  auVar230 = ZEXT3264(local_760);
                  auVar232 = ZEXT3264(local_900);
                  goto LAB_01af0ab8;
                }
              }
              bVar58 = uVar55 < 4;
              uVar55 = uVar55 + 1;
            } while (uVar55 != 5);
            bVar58 = false;
            bVar51 = 5;
LAB_01af0a55:
            bVar52 = bVar51;
            auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
LAB_01af0a70:
            auVar226 = ZEXT3264(local_720);
            auVar245 = ZEXT3264(local_680);
            auVar246 = ZEXT3264(local_7a0);
            auVar244 = ZEXT3264(local_7c0);
            auVar235 = ZEXT3264(local_7e0);
            auVar237 = ZEXT3264(local_800);
            auVar242 = ZEXT3264(local_860);
            auVar243 = ZEXT3264(local_880);
            auVar239 = ZEXT3264(local_640);
            auVar240 = ZEXT3264(local_660);
            auVar228 = ZEXT3264(local_740);
            auVar230 = ZEXT3264(local_760);
            auVar232 = ZEXT3264(local_900);
LAB_01af0ab8:
            bVar56 = (bool)(bVar56 | bVar58 & bVar52);
            fVar149 = ray->tfar;
            auVar130._4_4_ = fVar149;
            auVar130._0_4_ = fVar149;
            auVar130._8_4_ = fVar149;
            auVar130._12_4_ = fVar149;
            auVar130._16_4_ = fVar149;
            auVar130._20_4_ = fVar149;
            auVar130._24_4_ = fVar149;
            auVar130._28_4_ = fVar149;
            auVar48._4_4_ = fStack_35c;
            auVar48._0_4_ = local_360;
            auVar48._8_4_ = fStack_358;
            auVar48._12_4_ = fStack_354;
            auVar48._16_4_ = fStack_350;
            auVar48._20_4_ = fStack_34c;
            auVar48._24_4_ = fStack_348;
            auVar48._28_4_ = fStack_344;
            uVar15 = vcmpps_avx512vl(auVar130,auVar48,0xd);
            bVar53 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar53 & (byte)uVar15;
            auVar73 = local_260;
          } while (bVar53 != 0);
        }
        bVar53 = local_380[0] | (byte)local_888;
        auVar146._0_4_ = fVar133 + auVar73._0_4_;
        auVar146._4_4_ = fVar148 + auVar73._4_4_;
        auVar146._8_4_ = fVar150 + auVar73._8_4_;
        auVar146._12_4_ = fVar152 + auVar73._12_4_;
        auVar146._16_4_ = fVar132 + auVar73._16_4_;
        auVar146._20_4_ = fVar154 + auVar73._20_4_;
        auVar146._24_4_ = fVar156 + auVar73._24_4_;
        auVar146._28_4_ = fVar158 + auVar73._28_4_;
        uVar15 = vcmpps_avx512vl(auVar146,auVar130,2);
        bVar50 = (byte)uVar16 & bVar50 & (byte)uVar15;
        auVar147._8_4_ = 2;
        auVar147._0_8_ = 0x200000002;
        auVar147._12_4_ = 2;
        auVar147._16_4_ = 2;
        auVar147._20_4_ = 2;
        auVar147._24_4_ = 2;
        auVar147._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar73 = vpblendmd_avx512vl(auVar147,auVar33);
        auVar108._0_4_ = (uint)(bVar53 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar53 & 1) * 2;
        bVar58 = (bool)(bVar53 >> 1 & 1);
        auVar108._4_4_ = (uint)bVar58 * auVar73._4_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar53 >> 2 & 1);
        auVar108._8_4_ = (uint)bVar58 * auVar73._8_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar53 >> 3 & 1);
        auVar108._12_4_ = (uint)bVar58 * auVar73._12_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar53 >> 4 & 1);
        auVar108._16_4_ = (uint)bVar58 * auVar73._16_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar53 >> 5 & 1);
        auVar108._20_4_ = (uint)bVar58 * auVar73._20_4_ | (uint)!bVar58 * 2;
        bVar58 = (bool)(bVar53 >> 6 & 1);
        auVar108._24_4_ = (uint)bVar58 * auVar73._24_4_ | (uint)!bVar58 * 2;
        auVar108._28_4_ = (uint)(bVar53 >> 7) * auVar73._28_4_ | (uint)!(bool)(bVar53 >> 7) * 2;
        uVar15 = vpcmpd_avx512vl(local_320,auVar108,5);
        bVar53 = (byte)uVar15 & bVar50;
        if (bVar53 != 0) {
          local_380 = auVar108;
          auVar64 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
          auVar66 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
          _local_6a0 = local_2e0;
          auVar69 = vminps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar70 = vminps_avx(auVar64,auVar69);
          auVar64 = vmaxps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar212 = ZEXT3264(local_2e0);
          auVar69 = vmaxps_avx(auVar66,auVar64);
          auVar170._8_4_ = 0x7fffffff;
          auVar170._0_8_ = 0x7fffffff7fffffff;
          auVar170._12_4_ = 0x7fffffff;
          auVar66 = vandps_avx(auVar70,auVar170);
          auVar64 = vandps_avx(auVar69,auVar170);
          auVar66 = vmaxps_avx(auVar66,auVar64);
          auVar64 = vmovshdup_avx(auVar66);
          auVar64 = vmaxss_avx(auVar64,auVar66);
          auVar66 = vshufpd_avx(auVar66,auVar66,1);
          auVar66 = vmaxss_avx(auVar66,auVar64);
          fVar134 = auVar66._0_4_ * 1.9073486e-06;
          local_510 = vshufps_avx(auVar69,auVar69,0xff);
          local_360 = fVar133 + local_2e0._0_4_;
          fStack_35c = fVar148 + local_2e0._4_4_;
          fStack_358 = fVar150 + local_2e0._8_4_;
          fStack_354 = fVar152 + local_2e0._12_4_;
          fStack_350 = fVar132 + local_2e0._16_4_;
          fStack_34c = fVar154 + local_2e0._20_4_;
          fStack_348 = fVar156 + local_2e0._24_4_;
          fStack_344 = fVar158 + local_2e0._28_4_;
          do {
            auVar75 = _local_8e0;
            auVar131._8_4_ = 0x7f800000;
            auVar131._0_8_ = 0x7f8000007f800000;
            auVar131._12_4_ = 0x7f800000;
            auVar131._16_4_ = 0x7f800000;
            auVar131._20_4_ = 0x7f800000;
            auVar131._24_4_ = 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar73 = vblendmps_avx512vl(auVar131,auVar212._0_32_);
            auVar109._0_4_ =
                 (uint)(bVar53 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar53 & 1) * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 1 & 1);
            auVar109._4_4_ = (uint)bVar58 * auVar73._4_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 2 & 1);
            auVar109._8_4_ = (uint)bVar58 * auVar73._8_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 3 & 1);
            auVar109._12_4_ = (uint)bVar58 * auVar73._12_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 4 & 1);
            auVar109._16_4_ = (uint)bVar58 * auVar73._16_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 5 & 1);
            auVar109._20_4_ = (uint)bVar58 * auVar73._20_4_ | (uint)!bVar58 * 0x7f800000;
            bVar58 = (bool)(bVar53 >> 6 & 1);
            auVar109._24_4_ = (uint)bVar58 * auVar73._24_4_ | (uint)!bVar58 * 0x7f800000;
            auVar109._28_4_ =
                 (uint)(bVar53 >> 7) * auVar73._28_4_ | (uint)!(bool)(bVar53 >> 7) * 0x7f800000;
            auVar73 = vshufps_avx(auVar109,auVar109,0xb1);
            auVar73 = vminps_avx(auVar109,auVar73);
            auVar74 = vshufpd_avx(auVar73,auVar73,5);
            auVar73 = vminps_avx(auVar73,auVar74);
            auVar74 = vpermpd_avx2(auVar73,0x4e);
            auVar73 = vminps_avx(auVar73,auVar74);
            uVar15 = vcmpps_avx512vl(auVar109,auVar73,0);
            bVar51 = (byte)uVar15 & bVar53;
            bVar52 = bVar53;
            if (bVar51 != 0) {
              bVar52 = bVar51;
            }
            iVar19 = 0;
            for (uVar61 = (uint)bVar52; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_5e0._0_16_ = (undefined1  [16])aVar1;
            auVar66 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar66._0_4_ < 0.0) {
              local_8e0[1] = 0;
              local_8e0[0] = bVar53;
              stack0xfffffffffffff722 = auVar75._2_30_;
              _local_700 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
              local_620._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar19 << 2)));
              fVar133 = sqrtf(auVar66._0_4_);
              bVar53 = local_8e0[0];
              auVar66 = local_620._0_16_;
              auVar64 = _local_700;
            }
            else {
              auVar66 = vsqrtss_avx(auVar66,auVar66);
              fVar133 = auVar66._0_4_;
              auVar66 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar19 << 2)));
              auVar64 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
            }
            auVar66 = vinsertps_avx512f(auVar66,auVar64,0x10);
            bVar58 = true;
            uVar55 = 0;
            do {
              auVar64 = vbroadcastss_avx512vl(auVar66);
              auVar69 = vfmadd132ps_fma(auVar64,ZEXT816(0) << 0x40,local_5e0._0_16_);
              auVar64 = vmovshdup_avx512vl(auVar66);
              local_3e0._0_16_ = auVar64;
              fVar154 = 1.0 - auVar64._0_4_;
              auVar64 = vshufps_avx512vl(auVar66,auVar66,0x55);
              fVar148 = auVar64._0_4_;
              auVar171._0_4_ = local_4a0._0_4_ * fVar148;
              fVar150 = auVar64._4_4_;
              auVar171._4_4_ = local_4a0._4_4_ * fVar150;
              fVar152 = auVar64._8_4_;
              auVar171._8_4_ = local_4a0._8_4_ * fVar152;
              fVar132 = auVar64._12_4_;
              auVar171._12_4_ = local_4a0._12_4_ * fVar132;
              _local_3c0 = ZEXT416((uint)fVar154);
              auVar189._4_4_ = fVar154;
              auVar189._0_4_ = fVar154;
              auVar189._8_4_ = fVar154;
              auVar189._12_4_ = fVar154;
              auVar64 = vfmadd231ps_fma(auVar171,auVar189,local_460._0_16_);
              auVar201._0_4_ = local_480._0_4_ * fVar148;
              auVar201._4_4_ = local_480._4_4_ * fVar150;
              auVar201._8_4_ = local_480._8_4_ * fVar152;
              auVar201._12_4_ = local_480._12_4_ * fVar132;
              auVar70 = vfmadd231ps_fma(auVar201,auVar189,local_4a0._0_16_);
              auVar209._0_4_ = fVar148 * (float)local_4c0._0_4_;
              auVar209._4_4_ = fVar150 * (float)local_4c0._4_4_;
              auVar209._8_4_ = fVar152 * fStack_4b8;
              auVar209._12_4_ = fVar132 * fStack_4b4;
              auVar67 = vfmadd231ps_fma(auVar209,auVar189,local_480._0_16_);
              auVar217._0_4_ = fVar148 * auVar70._0_4_;
              auVar217._4_4_ = fVar150 * auVar70._4_4_;
              auVar217._8_4_ = fVar152 * auVar70._8_4_;
              auVar217._12_4_ = fVar132 * auVar70._12_4_;
              auVar64 = vfmadd231ps_fma(auVar217,auVar189,auVar64);
              auVar172._0_4_ = fVar148 * auVar67._0_4_;
              auVar172._4_4_ = fVar150 * auVar67._4_4_;
              auVar172._8_4_ = fVar152 * auVar67._8_4_;
              auVar172._12_4_ = fVar132 * auVar67._12_4_;
              auVar70 = vfmadd231ps_fma(auVar172,auVar189,auVar70);
              auVar202._0_4_ = fVar148 * auVar70._0_4_;
              auVar202._4_4_ = fVar150 * auVar70._4_4_;
              auVar202._8_4_ = fVar152 * auVar70._8_4_;
              auVar202._12_4_ = fVar132 * auVar70._12_4_;
              auVar67 = vfmadd231ps_fma(auVar202,auVar64,auVar189);
              auVar64 = vsubps_avx(auVar70,auVar64);
              auVar27._8_4_ = 0x40400000;
              auVar27._0_8_ = 0x4040000040400000;
              auVar27._12_4_ = 0x40400000;
              auVar64 = vmulps_avx512vl(auVar64,auVar27);
              _local_8e0 = auVar64;
              local_3a0._0_16_ = auVar67;
              auVar64 = vsubps_avx(auVar69,auVar67);
              _local_700 = auVar64;
              auVar64 = vdpps_avx(auVar64,auVar64,0x7f);
              local_620._0_16_ = auVar64;
              local_540._0_16_ = auVar66;
              if (auVar64._0_4_ < 0.0) {
                auVar232._0_4_ = sqrtf(auVar64._0_4_);
                auVar232._4_60_ = extraout_var_00;
                auVar66 = auVar232._0_16_;
              }
              else {
                auVar66 = vsqrtss_avx(auVar64,auVar64);
              }
              local_400._0_16_ = vdpps_avx(_local_8e0,_local_8e0,0x7f);
              fVar150 = local_400._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar150;
              local_580._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              fVar148 = local_580._0_4_ * 1.5;
              local_420._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_400._0_16_,auVar28);
              auVar64 = vfnmadd213ss_fma(local_420._0_16_,local_400._0_16_,ZEXT416(0x40000000));
              local_440._0_4_ = auVar64._0_4_;
              local_560._0_4_ = auVar66._0_4_;
              if (fVar150 < auVar69._0_4_) {
                local_8a0._0_4_ = fVar148;
                local_8b0._0_4_ = fVar150 * -0.5;
                auVar235._0_4_ = sqrtf(fVar150);
                auVar235._4_60_ = extraout_var_01;
                auVar66 = ZEXT416((uint)local_560._0_4_);
                auVar64 = auVar235._0_16_;
                fVar148 = (float)local_8a0._0_4_;
              }
              else {
                auVar64 = vsqrtss_avx512f(local_400._0_16_,local_400._0_16_);
                local_8b0._0_4_ = fVar150 * -0.5;
              }
              fVar150 = local_580._0_4_;
              fVar148 = fVar148 + (float)local_8b0._0_4_ * fVar150 * fVar150 * fVar150;
              local_8b0._0_4_ = fVar148 * (float)local_8e0._0_4_;
              local_8b0._4_4_ = fVar148 * (float)local_8e0._4_4_;
              local_8b0._8_4_ = fVar148 * fStack_8d8;
              local_8b0._12_4_ = fVar148 * fStack_8d4;
              local_580._0_16_ = vdpps_avx(_local_700,local_8b0,0x7f);
              auVar67 = vaddss_avx512f(auVar66,ZEXT416(0x3f800000));
              auVar124._0_4_ = local_580._0_4_ * local_580._0_4_;
              auVar124._4_4_ = local_580._4_4_ * local_580._4_4_;
              auVar124._8_4_ = local_580._8_4_ * local_580._8_4_;
              auVar124._12_4_ = local_580._12_4_ * local_580._12_4_;
              auVar69 = vsubps_avx(local_620._0_16_,auVar124);
              fVar150 = auVar69._0_4_;
              auVar140._4_12_ = ZEXT812(0) << 0x20;
              auVar140._0_4_ = fVar150;
              auVar70 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar140);
              auVar71 = vmulss_avx512f(auVar70,ZEXT416(0x3fc00000));
              local_8a0._0_4_ = auVar71._0_4_;
              uVar59 = fVar150 == 0.0;
              uVar57 = fVar150 < 0.0;
              if ((bool)uVar57) {
                local_4e0._0_4_ = auVar64._0_4_;
                local_500 = fVar148;
                fStack_4fc = fVar148;
                fStack_4f8 = fVar148;
                fStack_4f4 = fVar148;
                local_4f0 = auVar70;
                fVar152 = sqrtf(fVar150);
                auVar64 = ZEXT416((uint)local_4e0._0_4_);
                auVar66 = ZEXT416((uint)local_560._0_4_);
                auVar67 = ZEXT416(auVar67._0_4_);
                auVar70 = local_4f0;
                fVar148 = local_500;
                fVar132 = fStack_4fc;
                fVar154 = fStack_4f8;
                fVar156 = fStack_4f4;
              }
              else {
                auVar69 = vsqrtss_avx(auVar69,auVar69);
                fVar152 = auVar69._0_4_;
                fVar132 = fVar148;
                fVar154 = fVar148;
                fVar156 = fVar148;
              }
              in_ZMM31 = ZEXT1664(auVar70);
              auVar228 = ZEXT3264(local_740);
              auVar230 = ZEXT3264(local_760);
              auVar232 = ZEXT3264(local_900);
              auVar246 = ZEXT3264(local_7a0);
              auVar244 = ZEXT3264(local_7c0);
              auVar235 = ZEXT3264(local_7e0);
              auVar237 = ZEXT3264(local_800);
              auVar238 = ZEXT3264(local_820);
              auVar239 = ZEXT3264(local_640);
              auVar240 = ZEXT3264(local_660);
              auVar241 = ZEXT3264(local_840);
              auVar242 = ZEXT3264(local_860);
              auVar243 = ZEXT3264(local_880);
              auVar245 = ZEXT3264(local_680);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_3c0,local_3e0._0_16_);
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3e0._0_16_,_local_3c0);
              fVar158 = auVar69._0_4_ * 6.0;
              fVar149 = local_3e0._0_4_ * 6.0;
              auVar190._0_4_ = fVar149 * (float)local_4c0._0_4_;
              auVar190._4_4_ = fVar149 * (float)local_4c0._4_4_;
              auVar190._8_4_ = fVar149 * fStack_4b8;
              auVar190._12_4_ = fVar149 * fStack_4b4;
              auVar174._4_4_ = fVar158;
              auVar174._0_4_ = fVar158;
              auVar174._8_4_ = fVar158;
              auVar174._12_4_ = fVar158;
              auVar69 = vfmadd132ps_fma(auVar174,auVar190,local_480._0_16_);
              fVar158 = auVar71._0_4_ * 6.0;
              auVar141._4_4_ = fVar158;
              auVar141._0_4_ = fVar158;
              auVar141._8_4_ = fVar158;
              auVar141._12_4_ = fVar158;
              auVar69 = vfmadd132ps_fma(auVar141,auVar69,local_4a0._0_16_);
              fVar158 = local_3c0._0_4_ * 6.0;
              auVar175._4_4_ = fVar158;
              auVar175._0_4_ = fVar158;
              auVar175._8_4_ = fVar158;
              auVar175._12_4_ = fVar158;
              auVar69 = vfmadd132ps_fma(auVar175,auVar69,local_460._0_16_);
              auVar142._0_4_ = auVar69._0_4_ * (float)local_400._0_4_;
              auVar142._4_4_ = auVar69._4_4_ * (float)local_400._0_4_;
              auVar142._8_4_ = auVar69._8_4_ * (float)local_400._0_4_;
              auVar142._12_4_ = auVar69._12_4_ * (float)local_400._0_4_;
              auVar69 = vdpps_avx(_local_8e0,auVar69,0x7f);
              fVar158 = auVar69._0_4_;
              auVar176._0_4_ = local_8e0._0_4_ * fVar158;
              auVar176._4_4_ = local_8e0._4_4_ * fVar158;
              auVar176._8_4_ = local_8e0._8_4_ * fVar158;
              auVar176._12_4_ = local_8e0._12_4_ * fVar158;
              auVar69 = vsubps_avx(auVar142,auVar176);
              fVar158 = (float)local_440._0_4_ * (float)local_420._0_4_;
              auVar71 = vmulss_avx512f(local_540._0_16_,ZEXT416((uint)(fVar133 * 1.9073486e-06)));
              auVar71 = vmaxss_avx(ZEXT416((uint)fVar134),auVar71);
              auVar29._8_4_ = 0x80000000;
              auVar29._0_8_ = 0x8000000080000000;
              auVar29._12_4_ = 0x80000000;
              auVar68 = vxorps_avx512vl(_local_8e0,auVar29);
              auVar177._0_4_ = fVar148 * auVar69._0_4_ * fVar158;
              auVar177._4_4_ = fVar132 * auVar69._4_4_ * fVar158;
              auVar177._8_4_ = fVar154 * auVar69._8_4_ * fVar158;
              auVar177._12_4_ = fVar156 * auVar69._12_4_ * fVar158;
              auVar69 = vdpps_avx(auVar68,local_8b0,0x7f);
              auVar72 = vdivss_avx512f(ZEXT416((uint)fVar134),auVar64);
              auVar64 = vfmadd213ss_fma(auVar66,ZEXT416((uint)fVar134),auVar71);
              auVar66 = vdpps_avx(_local_700,auVar177,0x7f);
              vfmadd213ss_avx512f(auVar67,auVar72,auVar64);
              fVar148 = auVar69._0_4_ + auVar66._0_4_;
              auVar66 = vdpps_avx(local_5e0._0_16_,local_8b0,0x7f);
              auVar64 = vdpps_avx(_local_700,auVar68,0x7f);
              auVar69 = vmulss_avx512f(auVar70,ZEXT416((uint)(fVar150 * -0.5)));
              auVar70 = vmulss_avx512f(auVar70,auVar70);
              fVar150 = auVar69._0_4_ * auVar70._0_4_ + (float)local_8a0._0_4_;
              auVar69 = vdpps_avx(_local_700,local_5e0._0_16_,0x7f);
              auVar67 = vfnmadd231ss_avx512f(auVar64,local_580._0_16_,ZEXT416((uint)fVar148));
              auVar69 = vfnmadd231ss_avx512f(auVar69,local_580._0_16_,auVar66);
              auVar64 = vpermilps_avx(local_3a0._0_16_,0xff);
              fVar152 = fVar152 - auVar64._0_4_;
              auVar70 = vshufps_avx(_local_8e0,_local_8e0,0xff);
              auVar64 = vfmsub213ss_fma(auVar67,ZEXT416((uint)fVar150),auVar70);
              auVar222._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
              auVar222._8_4_ = auVar64._8_4_ ^ 0x80000000;
              auVar222._12_4_ = auVar64._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * fVar150));
              auVar67 = vfmsub231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar64._0_4_)),
                                        ZEXT416((uint)fVar148),auVar69);
              auVar64 = vinsertps_avx(auVar222,auVar69,0x1c);
              auVar210._0_8_ = auVar66._0_8_ ^ 0x8000000080000000;
              auVar210._8_4_ = auVar66._8_4_ ^ 0x80000000;
              auVar210._12_4_ = auVar66._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar148),auVar210,0x10);
              auVar191._0_4_ = auVar67._0_4_;
              auVar191._4_4_ = auVar191._0_4_;
              auVar191._8_4_ = auVar191._0_4_;
              auVar191._12_4_ = auVar191._0_4_;
              auVar66 = vdivps_avx(auVar64,auVar191);
              auVar64 = vdivps_avx(auVar69,auVar191);
              auVar69 = vbroadcastss_avx512vl(local_580._0_16_);
              auVar192._0_4_ = auVar69._0_4_ * auVar66._0_4_ + fVar152 * auVar64._0_4_;
              auVar192._4_4_ = auVar69._4_4_ * auVar66._4_4_ + fVar152 * auVar64._4_4_;
              auVar192._8_4_ = auVar69._8_4_ * auVar66._8_4_ + fVar152 * auVar64._8_4_;
              auVar192._12_4_ = auVar69._12_4_ * auVar66._12_4_ + fVar152 * auVar64._12_4_;
              auVar66 = vsubps_avx512vl(local_540._0_16_,auVar192);
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar64 = vandps_avx512vl(local_580._0_16_,auVar30);
              auVar64 = vucomiss_avx512f(auVar64);
              if (!(bool)uVar57 && !(bool)uVar59) {
                auVar64 = vaddss_avx512f(auVar71,auVar64);
                auVar64 = vfmadd231ss_fma(auVar64,local_510,ZEXT416(0x36000000));
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar152),auVar31);
                if (auVar69._0_4_ < auVar64._0_4_) {
                  auVar64 = vaddss_avx512f(auVar66,ZEXT416((uint)local_520._0_4_));
                  bVar51 = 0;
                  fVar149 = auVar64._0_4_;
                  auVar226 = ZEXT3264(local_720);
                  bVar52 = 0;
                  if (fVar149 < (ray->org).field_0.m128[3]) goto LAB_01af165c;
                  auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar212 = ZEXT3264(_local_6a0);
                  fVar133 = (float)local_940._0_4_;
                  fVar148 = (float)local_940._4_4_;
                  fVar150 = fStack_938;
                  fVar152 = fStack_934;
                  fVar132 = fStack_930;
                  fVar154 = fStack_92c;
                  fVar156 = fStack_928;
                  fVar158 = fStack_924;
                  if (ray->tfar < fVar149) goto LAB_01af1674;
                  auVar66 = vmovshdup_avx512vl(auVar66);
                  bVar51 = 0;
                  fVar151 = auVar66._0_4_;
                  if ((fVar151 < 0.0) || (1.0 < fVar151)) goto LAB_01af1674;
                  auVar47._12_4_ = 0;
                  auVar47._0_12_ = ZEXT812(0);
                  auVar66 = vrsqrt14ss_avx512f(auVar47 << 0x20,ZEXT416((uint)local_620._0_4_));
                  fVar133 = auVar66._0_4_;
                  pGVar4 = (context->scene->geometries).items[local_908].ptr;
                  if ((pGVar4->mask & ray->mask) == 0) {
                    bVar51 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar51 = 1, pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_5e0._0_4_ = ray->tfar;
                    fVar133 = fVar133 * 1.5 +
                              (float)local_620._0_4_ * -0.5 * fVar133 * fVar133 * fVar133;
                    auVar193._0_4_ = local_700._0_4_ * fVar133;
                    auVar193._4_4_ = local_700._4_4_ * fVar133;
                    auVar193._8_4_ = local_700._8_4_ * fVar133;
                    auVar193._12_4_ = local_700._12_4_ * fVar133;
                    auVar70 = vfmadd213ps_fma(auVar70,auVar193,_local_8e0);
                    auVar66 = vshufps_avx(auVar193,auVar193,0xc9);
                    auVar64 = vshufps_avx(_local_8e0,_local_8e0,0xc9);
                    auVar194._0_4_ = auVar193._0_4_ * auVar64._0_4_;
                    auVar194._4_4_ = auVar193._4_4_ * auVar64._4_4_;
                    auVar194._8_4_ = auVar193._8_4_ * auVar64._8_4_;
                    auVar194._12_4_ = auVar193._12_4_ * auVar64._12_4_;
                    auVar69 = vfmsub231ps_fma(auVar194,_local_8e0,auVar66);
                    auVar66 = vshufps_avx(auVar69,auVar69,0xc9);
                    auVar64 = vshufps_avx(auVar70,auVar70,0xc9);
                    auVar69 = vshufps_avx(auVar69,auVar69,0xd2);
                    auVar125._0_4_ = auVar70._0_4_ * auVar69._0_4_;
                    auVar125._4_4_ = auVar70._4_4_ * auVar69._4_4_;
                    auVar125._8_4_ = auVar70._8_4_ * auVar69._8_4_;
                    auVar125._12_4_ = auVar70._12_4_ * auVar69._12_4_;
                    auVar64 = vfmsub231ps_fma(auVar125,auVar66,auVar64);
                    auVar66 = vshufps_avx(auVar64,auVar64,0xe9);
                    local_5c0 = vmovlps_avx(auVar66);
                    local_5b8 = auVar64._0_4_;
                    local_5b4 = fVar151;
                    local_5b0 = 0;
                    local_5ac = (int)local_588;
                    local_5a8 = (int)local_908;
                    local_5a4 = context->user->instID[0];
                    local_5a0 = context->user->instPrimID[0];
                    ray->tfar = fVar149;
                    local_944 = -1;
                    local_6d0.valid = &local_944;
                    local_6d0.geometryUserPtr = pGVar4->userPtr;
                    local_6d0.context = context->user;
                    local_6d0.ray = (RTCRayN *)ray;
                    local_6d0.hit = (RTCHitN *)&local_5c0;
                    local_6d0.N = 1;
                    if ((pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar4->occlusionFilterN)(&local_6d0), *local_6d0.valid != 0)) {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                            RTC_RAY_QUERY_FLAG_INCOHERENT ||
                           (((pGVar4->field_8).field_0x2 & 0x40) != 0)) &&
                          ((*p_Var5)(&local_6d0), *local_6d0.valid == 0)))) goto LAB_01af18f1;
                      bVar51 = 1;
                    }
                    else {
LAB_01af18f1:
                      ray->tfar = (float)local_5e0._0_4_;
                      bVar51 = 0;
                    }
                    auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    auVar228 = ZEXT3264(local_740);
                    auVar230 = ZEXT3264(local_760);
                    auVar232 = ZEXT3264(local_900);
                    auVar246 = ZEXT3264(local_7a0);
                    auVar244 = ZEXT3264(local_7c0);
                    auVar235 = ZEXT3264(local_7e0);
                    auVar237 = ZEXT3264(local_800);
                    auVar238 = ZEXT3264(local_820);
                    auVar239 = ZEXT3264(local_640);
                    auVar240 = ZEXT3264(local_660);
                    auVar241 = ZEXT3264(local_840);
                    auVar242 = ZEXT3264(local_860);
                    auVar243 = ZEXT3264(local_880);
                    auVar245 = ZEXT3264(local_680);
                  }
                  goto LAB_01af166b;
                }
              }
              bVar58 = uVar55 < 4;
              uVar55 = uVar55 + 1;
            } while (uVar55 != 5);
            bVar58 = false;
            bVar52 = 5;
LAB_01af165c:
            bVar51 = bVar52;
            auVar219 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
LAB_01af166b:
            auVar226 = ZEXT3264(local_720);
            auVar212 = ZEXT3264(_local_6a0);
            fVar133 = (float)local_940._0_4_;
            fVar148 = (float)local_940._4_4_;
            fVar150 = fStack_938;
            fVar152 = fStack_934;
            fVar132 = fStack_930;
            fVar154 = fStack_92c;
            fVar156 = fStack_928;
            fVar158 = fStack_924;
LAB_01af1674:
            bVar56 = (bool)(bVar56 | bVar58 & bVar51);
            fVar149 = ray->tfar;
            auVar130._4_4_ = fVar149;
            auVar130._0_4_ = fVar149;
            auVar130._8_4_ = fVar149;
            auVar130._12_4_ = fVar149;
            auVar130._16_4_ = fVar149;
            auVar130._20_4_ = fVar149;
            auVar130._24_4_ = fVar149;
            auVar130._28_4_ = fVar149;
            auVar49._4_4_ = fStack_35c;
            auVar49._0_4_ = local_360;
            auVar49._8_4_ = fStack_358;
            auVar49._12_4_ = fStack_354;
            auVar49._16_4_ = fStack_350;
            auVar49._20_4_ = fStack_34c;
            auVar49._24_4_ = fStack_348;
            auVar49._28_4_ = fStack_344;
            uVar15 = vcmpps_avx512vl(auVar130,auVar49,0xd);
            bVar53 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar53 & (byte)uVar15;
            auVar108 = local_380;
          } while (bVar53 != 0);
        }
        uVar16 = vpcmpgtd_avx512vl(auVar108,local_320);
        uVar18 = vpcmpd_avx512vl(local_320,local_240,1);
        auVar179._0_4_ = fVar133 + (float)local_2a0._0_4_;
        auVar179._4_4_ = fVar148 + (float)local_2a0._4_4_;
        auVar179._8_4_ = fVar150 + fStack_298;
        auVar179._12_4_ = fVar152 + fStack_294;
        auVar179._16_4_ = fVar132 + fStack_290;
        auVar179._20_4_ = fVar154 + fStack_28c;
        auVar179._24_4_ = fVar156 + fStack_288;
        auVar179._28_4_ = fVar158 + fStack_284;
        uVar15 = vcmpps_avx512vl(auVar179,auVar130,2);
        bVar53 = (byte)local_884 & (byte)uVar18 & (byte)uVar15;
        auVar180._0_4_ = fVar133 + local_2e0._0_4_;
        auVar180._4_4_ = fVar148 + local_2e0._4_4_;
        auVar180._8_4_ = fVar150 + local_2e0._8_4_;
        auVar180._12_4_ = fVar152 + local_2e0._12_4_;
        auVar180._16_4_ = fVar132 + local_2e0._16_4_;
        auVar180._20_4_ = fVar154 + local_2e0._20_4_;
        auVar180._24_4_ = fVar156 + local_2e0._24_4_;
        auVar180._28_4_ = fVar158 + local_2e0._28_4_;
        uVar15 = vcmpps_avx512vl(auVar180,auVar130,2);
        bVar50 = bVar50 & (byte)uVar16 & (byte)uVar15 | bVar53;
        prim = local_4d0;
        if (bVar50 != 0) {
          abStack_180[uVar54 * 0x60] = bVar50;
          bVar58 = (bool)(bVar53 >> 1 & 1);
          bVar6 = (bool)(bVar53 >> 2 & 1);
          bVar7 = (bool)(bVar53 >> 3 & 1);
          bVar8 = (bool)(bVar53 >> 4 & 1);
          bVar9 = (bool)(bVar53 >> 5 & 1);
          bVar10 = (bool)(bVar53 >> 6 & 1);
          auStack_160[uVar54 * 0x18] =
               (uint)(bVar53 & 1) * local_2a0._0_4_ |
               (uint)!(bool)(bVar53 & 1) * (int)local_2e0._0_4_;
          auStack_160[uVar54 * 0x18 + 1] =
               (uint)bVar58 * local_2a0._4_4_ | (uint)!bVar58 * (int)local_2e0._4_4_;
          auStack_160[uVar54 * 0x18 + 2] =
               (uint)bVar6 * (int)fStack_298 | (uint)!bVar6 * (int)local_2e0._8_4_;
          auStack_160[uVar54 * 0x18 + 3] =
               (uint)bVar7 * (int)fStack_294 | (uint)!bVar7 * (int)local_2e0._12_4_;
          auStack_160[uVar54 * 0x18 + 4] =
               (uint)bVar8 * (int)fStack_290 | (uint)!bVar8 * (int)local_2e0._16_4_;
          auStack_160[uVar54 * 0x18 + 5] =
               (uint)bVar9 * (int)fStack_28c | (uint)!bVar9 * (int)local_2e0._20_4_;
          auStack_160[uVar54 * 0x18 + 6] =
               (uint)bVar10 * (int)fStack_288 | (uint)!bVar10 * (int)local_2e0._24_4_;
          auStack_160[uVar54 * 0x18 + 7] =
               (uint)(bVar53 >> 7) * (int)fStack_284 |
               (uint)!(bool)(bVar53 >> 7) * (int)local_2e0._28_4_;
          uVar55 = vmovlps_avx(local_330);
          (&uStack_140)[uVar54 * 0xc] = uVar55;
          aiStack_138[uVar54 * 0x18] = local_958 + 1;
          uVar54 = (ulong)((int)uVar54 + 1);
        }
      }
    }
    fVar149 = ray->tfar;
    fVar134 = ray->tfar;
    auVar143._4_4_ = fVar134;
    auVar143._0_4_ = fVar134;
    auVar143._8_4_ = fVar134;
    auVar143._12_4_ = fVar134;
    auVar143._16_4_ = fVar134;
    auVar143._20_4_ = fVar134;
    auVar143._24_4_ = fVar134;
    auVar143._28_4_ = fVar134;
    do {
      uVar61 = (uint)uVar54;
      uVar54 = (ulong)(uVar61 - 1);
      if (uVar61 == 0) {
        if (bVar56 != false) {
          return bVar56;
        }
        auVar126._4_4_ = fVar149;
        auVar126._0_4_ = fVar149;
        auVar126._8_4_ = fVar149;
        auVar126._12_4_ = fVar149;
        uVar15 = vcmpps_avx512vl(auVar126,local_340,0xd);
        uVar61 = (uint)local_4c8 & (uint)uVar15;
        local_4c8 = (ulong)uVar61;
        if (uVar61 == 0) {
          return false;
        }
        goto LAB_01aef3ac;
      }
      auVar73 = *(undefined1 (*) [32])(auStack_160 + uVar54 * 0x18);
      auVar195._0_4_ = fVar133 + auVar73._0_4_;
      auVar195._4_4_ = fVar148 + auVar73._4_4_;
      auVar195._8_4_ = fVar150 + auVar73._8_4_;
      auVar195._12_4_ = fVar152 + auVar73._12_4_;
      auVar195._16_4_ = fVar132 + auVar73._16_4_;
      auVar195._20_4_ = fVar154 + auVar73._20_4_;
      auVar195._24_4_ = fVar156 + auVar73._24_4_;
      auVar195._28_4_ = fVar158 + auVar73._28_4_;
      uVar15 = vcmpps_avx512vl(auVar195,auVar143,2);
      uVar110 = (uint)uVar15 & (uint)abStack_180[uVar54 * 0x60];
    } while (uVar110 == 0);
    uVar55 = (&uStack_140)[uVar54 * 0xc];
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar55;
    auVar144._8_4_ = 0x7f800000;
    auVar144._0_8_ = 0x7f8000007f800000;
    auVar144._12_4_ = 0x7f800000;
    auVar144._16_4_ = 0x7f800000;
    auVar144._20_4_ = 0x7f800000;
    auVar144._24_4_ = 0x7f800000;
    auVar144._28_4_ = 0x7f800000;
    auVar73 = vblendmps_avx512vl(auVar144,auVar73);
    bVar50 = (byte)uVar110;
    auVar106._0_4_ = (uint)(bVar50 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar50 & 1) * 0x7f800000;
    bVar58 = (bool)((byte)(uVar110 >> 1) & 1);
    auVar106._4_4_ = (uint)bVar58 * auVar73._4_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar110 >> 2) & 1);
    auVar106._8_4_ = (uint)bVar58 * auVar73._8_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar110 >> 3) & 1);
    auVar106._12_4_ = (uint)bVar58 * auVar73._12_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar110 >> 4) & 1);
    auVar106._16_4_ = (uint)bVar58 * auVar73._16_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar110 >> 5) & 1);
    auVar106._20_4_ = (uint)bVar58 * auVar73._20_4_ | (uint)!bVar58 * 0x7f800000;
    bVar58 = (bool)((byte)(uVar110 >> 6) & 1);
    auVar106._24_4_ = (uint)bVar58 * auVar73._24_4_ | (uint)!bVar58 * 0x7f800000;
    auVar106._28_4_ = (uVar110 >> 7) * auVar73._28_4_ | (uint)!SUB41(uVar110 >> 7,0) * 0x7f800000;
    auVar73 = vshufps_avx(auVar106,auVar106,0xb1);
    auVar73 = vminps_avx(auVar106,auVar73);
    auVar74 = vshufpd_avx(auVar73,auVar73,5);
    auVar73 = vminps_avx(auVar73,auVar74);
    auVar74 = vpermpd_avx2(auVar73,0x4e);
    auVar73 = vminps_avx(auVar73,auVar74);
    uVar15 = vcmpps_avx512vl(auVar106,auVar73,0);
    bVar53 = (byte)uVar15 & bVar50;
    if (bVar53 != 0) {
      uVar110 = (uint)bVar53;
    }
    uVar111 = 0;
    for (; (uVar110 & 1) == 0; uVar110 = uVar110 >> 1 | 0x80000000) {
      uVar111 = uVar111 + 1;
    }
    local_958 = aiStack_138[uVar54 * 0x18];
    bVar50 = ~('\x01' << ((byte)uVar111 & 0x1f)) & bVar50;
    abStack_180[uVar54 * 0x60] = bVar50;
    if (bVar50 == 0) {
      uVar61 = uVar61 - 1;
    }
    uVar117 = (undefined4)uVar55;
    auVar145._4_4_ = uVar117;
    auVar145._0_4_ = uVar117;
    auVar145._8_4_ = uVar117;
    auVar145._12_4_ = uVar117;
    auVar145._16_4_ = uVar117;
    auVar145._20_4_ = uVar117;
    auVar145._24_4_ = uVar117;
    auVar145._28_4_ = uVar117;
    auVar66 = vmovshdup_avx(auVar121);
    auVar66 = vsubps_avx(auVar66,auVar121);
    auVar127._0_4_ = auVar66._0_4_;
    auVar127._4_4_ = auVar127._0_4_;
    auVar127._8_4_ = auVar127._0_4_;
    auVar127._12_4_ = auVar127._0_4_;
    auVar127._16_4_ = auVar127._0_4_;
    auVar127._20_4_ = auVar127._0_4_;
    auVar127._24_4_ = auVar127._0_4_;
    auVar127._28_4_ = auVar127._0_4_;
    auVar66 = vfmadd132ps_fma(auVar127,auVar145,_DAT_01faff20);
    _local_2a0 = ZEXT1632(auVar66);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_2a0 + (ulong)uVar111 * 4);
    uVar54 = (ulong)uVar61;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }